

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::sse2::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::sse2::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Primitive *pPVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  Primitive PVar17;
  Geometry *pGVar18;
  __int_type_conflict _Var19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined6 uVar36;
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  int iVar58;
  undefined4 uVar59;
  ulong uVar60;
  long lVar61;
  undefined4 uVar65;
  long extraout_RAX;
  long extraout_RAX_00;
  long extraout_RAX_01;
  long extraout_RAX_02;
  RayK<4> *pRVar62;
  long extraout_RAX_03;
  long extraout_RAX_04;
  long extraout_RAX_05;
  long extraout_RAX_06;
  RTCFilterFunctionN p_Var63;
  ulong uVar64;
  RTCIntersectArguments *pRVar66;
  ulong uVar67;
  long lVar68;
  byte bVar69;
  ulong uVar70;
  int iVar71;
  long lVar72;
  RTCFilterFunctionNArguments *pRVar73;
  byte bVar74;
  uint uVar75;
  uint uVar76;
  uint uVar77;
  uint uVar78;
  uint uVar79;
  short sVar80;
  undefined2 uVar121;
  float fVar81;
  float fVar122;
  float fVar123;
  __m128 a_1;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar86 [16];
  undefined1 auVar89 [16];
  undefined1 auVar92 [16];
  undefined1 auVar95 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar124;
  float fVar150;
  float fVar151;
  undefined1 auVar125 [16];
  undefined1 auVar128 [16];
  undefined1 auVar131 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar152;
  float fVar166;
  float fVar167;
  vfloat4 v;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined4 uVar168;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar169;
  float fVar186;
  float fVar187;
  vfloat4 v_1;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar188;
  float fVar201;
  float fVar202;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar204;
  float fVar226;
  float fVar227;
  undefined1 auVar205 [16];
  undefined1 auVar208 [16];
  undefined1 auVar211 [16];
  undefined1 auVar214 [16];
  undefined1 auVar217 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar228;
  float fVar234;
  float fVar235;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar236;
  float fVar252;
  float fVar253;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar249 [16];
  undefined1 auVar251 [16];
  float fVar254;
  float fVar255;
  float fVar259;
  float fVar261;
  float fVar263;
  undefined1 auVar256 [16];
  float fVar260;
  float fVar262;
  float fVar264;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  float t_1;
  float fVar265;
  float fVar273;
  float fVar274;
  undefined1 auVar266 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar288;
  float fVar292;
  undefined1 auVar278 [16];
  undefined1 auVar281 [16];
  float fVar289;
  float fVar293;
  float fVar295;
  undefined1 auVar282 [16];
  float fVar290;
  float fVar294;
  float fVar296;
  undefined1 auVar283 [16];
  uint uVar291;
  uint uVar297;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  float fVar298;
  float fVar305;
  float fVar306;
  float fVar307;
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar303 [16];
  float fVar308;
  undefined1 auVar304 [16];
  float fVar309;
  float fVar310;
  float fVar319;
  undefined8 uVar311;
  float fVar318;
  float fVar320;
  float fVar324;
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar316 [16];
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar325;
  float fVar326;
  float fVar327;
  undefined1 auVar317 [16];
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  float s;
  float fVar344;
  float fVar348;
  float fVar349;
  float fVar350;
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx u_outer1;
  vfloatx u_outer0;
  vboolx valid;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  bool local_699;
  undefined1 local_648 [8];
  float fStack_640;
  float fStack_63c;
  undefined8 local_628;
  undefined1 local_618 [8];
  float fStack_610;
  float fStack_60c;
  undefined1 local_5f8 [8];
  float fStack_5f0;
  float fStack_5ec;
  undefined1 local_5c8 [8];
  float fStack_5c0;
  float fStack_5bc;
  undefined1 local_598 [8];
  float fStack_590;
  float fStack_58c;
  undefined1 local_588 [8];
  float fStack_580;
  float fStack_57c;
  undefined8 local_528;
  undefined8 uStack_520;
  RTCFilterFunctionNArguments *local_510;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  undefined1 local_4d8 [4];
  float fStack_4d4;
  undefined8 uStack_4d0;
  RTCRayQueryContext *local_4c8;
  RayK<4> *local_4c0;
  RTCHitN *local_4b8;
  uint local_4b0;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  float local_488;
  float fStack_484;
  undefined4 uStack_480;
  undefined4 uStack_47c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  undefined4 uStack_41c;
  undefined8 *local_418;
  ulong local_410;
  undefined1 local_408 [16];
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [16];
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [16];
  float local_368 [4];
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  Primitive *local_348;
  ulong local_340;
  uint local_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint local_328;
  uint uStack_324;
  uint uStack_320;
  uint uStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  uint local_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [16];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  uint local_f8 [4];
  float afStack_e8 [6];
  float local_d0 [40];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 uVar120;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar159 [16];
  undefined1 auVar163 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  uint uVar189;
  uint uVar203;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar248 [16];
  undefined1 auVar250 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  
  PVar17 = prim[1];
  uVar60 = (ulong)(byte)PVar17;
  lVar72 = uVar60 * 0x25;
  pPVar8 = prim + lVar72 + 6;
  fVar167 = *(float *)(pPVar8 + 0xc);
  fVar169 = (*(float *)(ray + k * 4) - *(float *)pPVar8) * fVar167;
  fVar186 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar8 + 4)) * fVar167;
  fVar187 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar8 + 8)) * fVar167;
  fVar152 = *(float *)(ray + k * 4 + 0x40) * fVar167;
  fVar166 = *(float *)(ray + k * 4 + 0x50) * fVar167;
  fVar167 = *(float *)(ray + k * 4 + 0x60) * fVar167;
  uVar59 = *(undefined4 *)(prim + uVar60 * 4 + 6);
  uVar120 = (undefined1)((uint)uVar59 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar59 >> 0x10);
  uVar311 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar59));
  uVar120 = (undefined1)((uint)uVar59 >> 8);
  uVar36 = CONCAT51(CONCAT41((int)((ulong)uVar311 >> 0x20),uVar120),uVar120);
  sVar80 = CONCAT11((char)uVar59,(char)uVar59);
  uVar70 = CONCAT62(uVar36,sVar80);
  auVar270._8_4_ = 0;
  auVar270._0_8_ = uVar70;
  auVar270._12_2_ = uVar121;
  auVar270._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar311 >> 0x20);
  auVar154._12_4_ = auVar270._12_4_;
  auVar154._8_2_ = 0;
  auVar154._0_8_ = uVar70;
  auVar154._10_2_ = uVar121;
  auVar82._10_6_ = auVar154._10_6_;
  auVar82._8_2_ = uVar121;
  auVar82._0_8_ = uVar70;
  uVar121 = (undefined2)uVar36;
  auVar37._4_8_ = auVar82._8_8_;
  auVar37._2_2_ = uVar121;
  auVar37._0_2_ = uVar121;
  fVar328 = (float)((int)sVar80 >> 8);
  fVar334 = (float)(auVar37._0_4_ >> 0x18);
  fVar336 = (float)(auVar82._8_4_ >> 0x18);
  uVar59 = *(undefined4 *)(prim + uVar60 * 5 + 6);
  uVar120 = (undefined1)((uint)uVar59 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar59 >> 0x10);
  uVar311 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar59));
  uVar120 = (undefined1)((uint)uVar59 >> 8);
  uVar36 = CONCAT51(CONCAT41((int)((ulong)uVar311 >> 0x20),uVar120),uVar120);
  sVar80 = CONCAT11((char)uVar59,(char)uVar59);
  uVar70 = CONCAT62(uVar36,sVar80);
  auVar127._8_4_ = 0;
  auVar127._0_8_ = uVar70;
  auVar127._12_2_ = uVar121;
  auVar127._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar311 >> 0x20);
  auVar126._12_4_ = auVar127._12_4_;
  auVar126._8_2_ = 0;
  auVar126._0_8_ = uVar70;
  auVar126._10_2_ = uVar121;
  auVar125._10_6_ = auVar126._10_6_;
  auVar125._8_2_ = uVar121;
  auVar125._0_8_ = uVar70;
  uVar121 = (undefined2)uVar36;
  auVar38._4_8_ = auVar125._8_8_;
  auVar38._2_2_ = uVar121;
  auVar38._0_2_ = uVar121;
  fVar188 = (float)((int)sVar80 >> 8);
  fVar201 = (float)(auVar38._0_4_ >> 0x18);
  fVar202 = (float)(auVar125._8_4_ >> 0x18);
  uVar59 = *(undefined4 *)(prim + uVar60 * 6 + 6);
  uVar120 = (undefined1)((uint)uVar59 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar59 >> 0x10);
  uVar311 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar59));
  uVar120 = (undefined1)((uint)uVar59 >> 8);
  uVar36 = CONCAT51(CONCAT41((int)((ulong)uVar311 >> 0x20),uVar120),uVar120);
  sVar80 = CONCAT11((char)uVar59,(char)uVar59);
  uVar70 = CONCAT62(uVar36,sVar80);
  auVar130._8_4_ = 0;
  auVar130._0_8_ = uVar70;
  auVar130._12_2_ = uVar121;
  auVar130._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar311 >> 0x20);
  auVar129._12_4_ = auVar130._12_4_;
  auVar129._8_2_ = 0;
  auVar129._0_8_ = uVar70;
  auVar129._10_2_ = uVar121;
  auVar128._10_6_ = auVar129._10_6_;
  auVar128._8_2_ = uVar121;
  auVar128._0_8_ = uVar70;
  uVar121 = (undefined2)uVar36;
  auVar39._4_8_ = auVar128._8_8_;
  auVar39._2_2_ = uVar121;
  auVar39._0_2_ = uVar121;
  fVar228 = (float)((int)sVar80 >> 8);
  fVar234 = (float)(auVar39._0_4_ >> 0x18);
  fVar235 = (float)(auVar128._8_4_ >> 0x18);
  uVar59 = *(undefined4 *)(prim + uVar60 * 0xf + 6);
  uVar120 = (undefined1)((uint)uVar59 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar59 >> 0x10);
  uVar311 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar59));
  uVar120 = (undefined1)((uint)uVar59 >> 8);
  uVar36 = CONCAT51(CONCAT41((int)((ulong)uVar311 >> 0x20),uVar120),uVar120);
  sVar80 = CONCAT11((char)uVar59,(char)uVar59);
  uVar70 = CONCAT62(uVar36,sVar80);
  auVar133._8_4_ = 0;
  auVar133._0_8_ = uVar70;
  auVar133._12_2_ = uVar121;
  auVar133._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar311 >> 0x20);
  auVar132._12_4_ = auVar133._12_4_;
  auVar132._8_2_ = 0;
  auVar132._0_8_ = uVar70;
  auVar132._10_2_ = uVar121;
  auVar131._10_6_ = auVar132._10_6_;
  auVar131._8_2_ = uVar121;
  auVar131._0_8_ = uVar70;
  uVar121 = (undefined2)uVar36;
  auVar40._4_8_ = auVar131._8_8_;
  auVar40._2_2_ = uVar121;
  auVar40._0_2_ = uVar121;
  fVar81 = (float)((int)sVar80 >> 8);
  fVar122 = (float)(auVar40._0_4_ >> 0x18);
  fVar123 = (float)(auVar131._8_4_ >> 0x18);
  uVar59 = *(undefined4 *)(prim + (ulong)(byte)PVar17 * 0x10 + 6);
  uVar120 = (undefined1)((uint)uVar59 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar59 >> 0x10);
  uVar311 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar59));
  uVar120 = (undefined1)((uint)uVar59 >> 8);
  uVar36 = CONCAT51(CONCAT41((int)((ulong)uVar311 >> 0x20),uVar120),uVar120);
  sVar80 = CONCAT11((char)uVar59,(char)uVar59);
  uVar70 = CONCAT62(uVar36,sVar80);
  auVar207._8_4_ = 0;
  auVar207._0_8_ = uVar70;
  auVar207._12_2_ = uVar121;
  auVar207._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar311 >> 0x20);
  auVar206._12_4_ = auVar207._12_4_;
  auVar206._8_2_ = 0;
  auVar206._0_8_ = uVar70;
  auVar206._10_2_ = uVar121;
  auVar205._10_6_ = auVar206._10_6_;
  auVar205._8_2_ = uVar121;
  auVar205._0_8_ = uVar70;
  uVar121 = (undefined2)uVar36;
  auVar41._4_8_ = auVar205._8_8_;
  auVar41._2_2_ = uVar121;
  auVar41._0_2_ = uVar121;
  fVar236 = (float)((int)sVar80 >> 8);
  fVar252 = (float)(auVar41._0_4_ >> 0x18);
  fVar253 = (float)(auVar205._8_4_ >> 0x18);
  uVar59 = *(undefined4 *)(prim + (ulong)(byte)PVar17 * 0x10 + uVar60 + 6);
  uVar120 = (undefined1)((uint)uVar59 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar59 >> 0x10);
  uVar311 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar59));
  uVar120 = (undefined1)((uint)uVar59 >> 8);
  uVar36 = CONCAT51(CONCAT41((int)((ulong)uVar311 >> 0x20),uVar120),uVar120);
  sVar80 = CONCAT11((char)uVar59,(char)uVar59);
  uVar70 = CONCAT62(uVar36,sVar80);
  auVar210._8_4_ = 0;
  auVar210._0_8_ = uVar70;
  auVar210._12_2_ = uVar121;
  auVar210._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar311 >> 0x20);
  auVar209._12_4_ = auVar210._12_4_;
  auVar209._8_2_ = 0;
  auVar209._0_8_ = uVar70;
  auVar209._10_2_ = uVar121;
  auVar208._10_6_ = auVar209._10_6_;
  auVar208._8_2_ = uVar121;
  auVar208._0_8_ = uVar70;
  uVar121 = (undefined2)uVar36;
  auVar42._4_8_ = auVar208._8_8_;
  auVar42._2_2_ = uVar121;
  auVar42._0_2_ = uVar121;
  fVar265 = (float)((int)sVar80 >> 8);
  fVar273 = (float)(auVar42._0_4_ >> 0x18);
  fVar274 = (float)(auVar208._8_4_ >> 0x18);
  uVar59 = *(undefined4 *)(prim + uVar60 * 0x1a + 6);
  uVar120 = (undefined1)((uint)uVar59 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar59 >> 0x10);
  uVar311 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar59));
  uVar120 = (undefined1)((uint)uVar59 >> 8);
  uVar36 = CONCAT51(CONCAT41((int)((ulong)uVar311 >> 0x20),uVar120),uVar120);
  sVar80 = CONCAT11((char)uVar59,(char)uVar59);
  uVar70 = CONCAT62(uVar36,sVar80);
  auVar213._8_4_ = 0;
  auVar213._0_8_ = uVar70;
  auVar213._12_2_ = uVar121;
  auVar213._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar311 >> 0x20);
  auVar212._12_4_ = auVar213._12_4_;
  auVar212._8_2_ = 0;
  auVar212._0_8_ = uVar70;
  auVar212._10_2_ = uVar121;
  auVar211._10_6_ = auVar212._10_6_;
  auVar211._8_2_ = uVar121;
  auVar211._0_8_ = uVar70;
  uVar121 = (undefined2)uVar36;
  auVar43._4_8_ = auVar211._8_8_;
  auVar43._2_2_ = uVar121;
  auVar43._0_2_ = uVar121;
  fVar254 = (float)((int)sVar80 >> 8);
  fVar259 = (float)(auVar43._0_4_ >> 0x18);
  fVar261 = (float)(auVar211._8_4_ >> 0x18);
  uVar59 = *(undefined4 *)(prim + uVar60 * 0x1b + 6);
  uVar120 = (undefined1)((uint)uVar59 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar59 >> 0x10);
  uVar311 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar59));
  uVar120 = (undefined1)((uint)uVar59 >> 8);
  uVar36 = CONCAT51(CONCAT41((int)((ulong)uVar311 >> 0x20),uVar120),uVar120);
  sVar80 = CONCAT11((char)uVar59,(char)uVar59);
  uVar70 = CONCAT62(uVar36,sVar80);
  auVar216._8_4_ = 0;
  auVar216._0_8_ = uVar70;
  auVar216._12_2_ = uVar121;
  auVar216._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar311 >> 0x20);
  auVar215._12_4_ = auVar216._12_4_;
  auVar215._8_2_ = 0;
  auVar215._0_8_ = uVar70;
  auVar215._10_2_ = uVar121;
  auVar214._10_6_ = auVar215._10_6_;
  auVar214._8_2_ = uVar121;
  auVar214._0_8_ = uVar70;
  uVar121 = (undefined2)uVar36;
  auVar44._4_8_ = auVar214._8_8_;
  auVar44._2_2_ = uVar121;
  auVar44._0_2_ = uVar121;
  fVar275 = (float)((int)sVar80 >> 8);
  fVar288 = (float)(auVar44._0_4_ >> 0x18);
  fVar292 = (float)(auVar214._8_4_ >> 0x18);
  uVar59 = *(undefined4 *)(prim + uVar60 * 0x1c + 6);
  uVar120 = (undefined1)((uint)uVar59 >> 0x18);
  uVar121 = CONCAT11(uVar120,uVar120);
  uVar120 = (undefined1)((uint)uVar59 >> 0x10);
  uVar311 = CONCAT35(CONCAT21(uVar121,uVar120),CONCAT14(uVar120,uVar59));
  uVar120 = (undefined1)((uint)uVar59 >> 8);
  uVar36 = CONCAT51(CONCAT41((int)((ulong)uVar311 >> 0x20),uVar120),uVar120);
  sVar80 = CONCAT11((char)uVar59,(char)uVar59);
  uVar70 = CONCAT62(uVar36,sVar80);
  auVar219._8_4_ = 0;
  auVar219._0_8_ = uVar70;
  auVar219._12_2_ = uVar121;
  auVar219._14_2_ = uVar121;
  uVar121 = (undefined2)((ulong)uVar311 >> 0x20);
  auVar218._12_4_ = auVar219._12_4_;
  auVar218._8_2_ = 0;
  auVar218._0_8_ = uVar70;
  auVar218._10_2_ = uVar121;
  auVar217._10_6_ = auVar218._10_6_;
  auVar217._8_2_ = uVar121;
  auVar217._0_8_ = uVar70;
  uVar121 = (undefined2)uVar36;
  auVar45._4_8_ = auVar217._8_8_;
  auVar45._2_2_ = uVar121;
  auVar45._0_2_ = uVar121;
  fVar124 = (float)((int)sVar80 >> 8);
  fVar150 = (float)(auVar45._0_4_ >> 0x18);
  fVar151 = (float)(auVar217._8_4_ >> 0x18);
  fVar309 = fVar152 * fVar328 + fVar166 * fVar188 + fVar167 * fVar228;
  fVar318 = fVar152 * fVar334 + fVar166 * fVar201 + fVar167 * fVar234;
  fVar320 = fVar152 * fVar336 + fVar166 * fVar202 + fVar167 * fVar235;
  fVar324 = fVar152 * (float)(auVar154._12_4_ >> 0x18) +
            fVar166 * (float)(auVar126._12_4_ >> 0x18) + fVar167 * (float)(auVar129._12_4_ >> 0x18);
  fVar298 = fVar152 * fVar81 + fVar166 * fVar236 + fVar167 * fVar265;
  fVar305 = fVar152 * fVar122 + fVar166 * fVar252 + fVar167 * fVar273;
  fVar306 = fVar152 * fVar123 + fVar166 * fVar253 + fVar167 * fVar274;
  fVar307 = fVar152 * (float)(auVar132._12_4_ >> 0x18) +
            fVar166 * (float)(auVar206._12_4_ >> 0x18) + fVar167 * (float)(auVar209._12_4_ >> 0x18);
  fVar204 = fVar152 * fVar254 + fVar166 * fVar275 + fVar167 * fVar124;
  fVar226 = fVar152 * fVar259 + fVar166 * fVar288 + fVar167 * fVar150;
  fVar227 = fVar152 * fVar261 + fVar166 * fVar292 + fVar167 * fVar151;
  fVar152 = fVar152 * (float)(auVar212._12_4_ >> 0x18) +
            fVar166 * (float)(auVar215._12_4_ >> 0x18) + fVar167 * (float)(auVar218._12_4_ >> 0x18);
  fVar329 = fVar328 * fVar169 + fVar188 * fVar186 + fVar228 * fVar187;
  fVar334 = fVar334 * fVar169 + fVar201 * fVar186 + fVar234 * fVar187;
  fVar336 = fVar336 * fVar169 + fVar202 * fVar186 + fVar235 * fVar187;
  fVar338 = (float)(auVar154._12_4_ >> 0x18) * fVar169 +
            (float)(auVar126._12_4_ >> 0x18) * fVar186 + (float)(auVar129._12_4_ >> 0x18) * fVar187;
  fVar265 = fVar81 * fVar169 + fVar236 * fVar186 + fVar265 * fVar187;
  fVar273 = fVar122 * fVar169 + fVar252 * fVar186 + fVar273 * fVar187;
  fVar274 = fVar123 * fVar169 + fVar253 * fVar186 + fVar274 * fVar187;
  fVar328 = (float)(auVar132._12_4_ >> 0x18) * fVar169 +
            (float)(auVar206._12_4_ >> 0x18) * fVar186 + (float)(auVar209._12_4_ >> 0x18) * fVar187;
  fVar254 = fVar169 * fVar254 + fVar186 * fVar275 + fVar187 * fVar124;
  fVar259 = fVar169 * fVar259 + fVar186 * fVar288 + fVar187 * fVar150;
  fVar261 = fVar169 * fVar261 + fVar186 * fVar292 + fVar187 * fVar151;
  fVar275 = fVar169 * (float)(auVar212._12_4_ >> 0x18) +
            fVar186 * (float)(auVar215._12_4_ >> 0x18) + fVar187 * (float)(auVar218._12_4_ >> 0x18);
  fVar167 = (float)DAT_01ff1d40;
  fVar81 = DAT_01ff1d40._4_4_;
  fVar122 = DAT_01ff1d40._8_4_;
  fVar123 = DAT_01ff1d40._12_4_;
  uVar75 = -(uint)(fVar167 <= ABS(fVar309));
  uVar76 = -(uint)(fVar81 <= ABS(fVar318));
  uVar77 = -(uint)(fVar122 <= ABS(fVar320));
  uVar78 = -(uint)(fVar123 <= ABS(fVar324));
  auVar312._0_4_ = (uint)fVar309 & uVar75;
  auVar312._4_4_ = (uint)fVar318 & uVar76;
  auVar312._8_4_ = (uint)fVar320 & uVar77;
  auVar312._12_4_ = (uint)fVar324 & uVar78;
  auVar170._0_4_ = ~uVar75 & (uint)fVar167;
  auVar170._4_4_ = ~uVar76 & (uint)fVar81;
  auVar170._8_4_ = ~uVar77 & (uint)fVar122;
  auVar170._12_4_ = ~uVar78 & (uint)fVar123;
  auVar170 = auVar170 | auVar312;
  uVar75 = -(uint)(fVar167 <= ABS(fVar298));
  uVar76 = -(uint)(fVar81 <= ABS(fVar305));
  uVar77 = -(uint)(fVar122 <= ABS(fVar306));
  uVar78 = -(uint)(fVar123 <= ABS(fVar307));
  auVar299._0_4_ = (uint)fVar298 & uVar75;
  auVar299._4_4_ = (uint)fVar305 & uVar76;
  auVar299._8_4_ = (uint)fVar306 & uVar77;
  auVar299._12_4_ = (uint)fVar307 & uVar78;
  auVar229._0_4_ = ~uVar75 & (uint)fVar167;
  auVar229._4_4_ = ~uVar76 & (uint)fVar81;
  auVar229._8_4_ = ~uVar77 & (uint)fVar122;
  auVar229._12_4_ = ~uVar78 & (uint)fVar123;
  auVar229 = auVar229 | auVar299;
  uVar75 = -(uint)(fVar167 <= ABS(fVar204));
  uVar76 = -(uint)(fVar81 <= ABS(fVar226));
  uVar77 = -(uint)(fVar122 <= ABS(fVar227));
  uVar78 = -(uint)(fVar123 <= ABS(fVar152));
  auVar220._0_4_ = (uint)fVar204 & uVar75;
  auVar220._4_4_ = (uint)fVar226 & uVar76;
  auVar220._8_4_ = (uint)fVar227 & uVar77;
  auVar220._12_4_ = (uint)fVar152 & uVar78;
  auVar237._0_4_ = ~uVar75 & (uint)fVar167;
  auVar237._4_4_ = ~uVar76 & (uint)fVar81;
  auVar237._8_4_ = ~uVar77 & (uint)fVar122;
  auVar237._12_4_ = ~uVar78 & (uint)fVar123;
  auVar237 = auVar237 | auVar220;
  auVar82 = rcpps(_DAT_01ff1d40,auVar170);
  fVar167 = auVar82._0_4_;
  fVar123 = auVar82._4_4_;
  fVar188 = auVar82._8_4_;
  fVar236 = auVar82._12_4_;
  fVar167 = (1.0 - auVar170._0_4_ * fVar167) * fVar167 + fVar167;
  fVar123 = (1.0 - auVar170._4_4_ * fVar123) * fVar123 + fVar123;
  fVar188 = (1.0 - auVar170._8_4_ * fVar188) * fVar188 + fVar188;
  fVar236 = (1.0 - auVar170._12_4_ * fVar236) * fVar236 + fVar236;
  auVar82 = rcpps(auVar82,auVar229);
  fVar81 = auVar82._0_4_;
  fVar124 = auVar82._4_4_;
  fVar201 = auVar82._8_4_;
  fVar252 = auVar82._12_4_;
  fVar81 = (1.0 - auVar229._0_4_ * fVar81) * fVar81 + fVar81;
  fVar124 = (1.0 - auVar229._4_4_ * fVar124) * fVar124 + fVar124;
  fVar201 = (1.0 - auVar229._8_4_ * fVar201) * fVar201 + fVar201;
  fVar252 = (1.0 - auVar229._12_4_ * fVar252) * fVar252 + fVar252;
  auVar82 = rcpps(auVar82,auVar237);
  fVar122 = auVar82._0_4_;
  fVar150 = auVar82._4_4_;
  fVar202 = auVar82._8_4_;
  fVar253 = auVar82._12_4_;
  fVar122 = (1.0 - auVar237._0_4_ * fVar122) * fVar122 + fVar122;
  fVar150 = (1.0 - auVar237._4_4_ * fVar150) * fVar150 + fVar150;
  fVar202 = (1.0 - auVar237._8_4_ * fVar202) * fVar202 + fVar202;
  fVar253 = (1.0 - auVar237._12_4_ * fVar253) * fVar253 + fVar253;
  fVar288 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar72 + 0x16)) *
            *(float *)(prim + lVar72 + 0x1a);
  uVar70 = *(ulong *)(prim + uVar60 * 7 + 6);
  uVar121 = (undefined2)(uVar70 >> 0x30);
  auVar178._8_4_ = 0;
  auVar178._0_8_ = uVar70;
  auVar178._12_2_ = uVar121;
  auVar178._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar70 >> 0x20);
  auVar155._12_4_ = auVar178._12_4_;
  auVar155._8_2_ = 0;
  auVar155._0_8_ = uVar70;
  auVar155._10_2_ = uVar121;
  auVar244._10_6_ = auVar155._10_6_;
  auVar244._8_2_ = uVar121;
  auVar244._0_8_ = uVar70;
  uVar121 = (undefined2)(uVar70 >> 0x10);
  auVar46._4_8_ = auVar244._8_8_;
  auVar46._2_2_ = uVar121;
  auVar46._0_2_ = uVar121;
  fVar151 = (float)(auVar46._0_4_ >> 0x10);
  fVar204 = (float)(auVar244._8_4_ >> 0x10);
  uVar64 = *(ulong *)(prim + uVar60 * 0xb + 6);
  uVar121 = (undefined2)(uVar64 >> 0x30);
  auVar173._8_4_ = 0;
  auVar173._0_8_ = uVar64;
  auVar173._12_2_ = uVar121;
  auVar173._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar64 >> 0x20);
  auVar172._12_4_ = auVar173._12_4_;
  auVar172._8_2_ = 0;
  auVar172._0_8_ = uVar64;
  auVar172._10_2_ = uVar121;
  auVar171._10_6_ = auVar172._10_6_;
  auVar171._8_2_ = uVar121;
  auVar171._0_8_ = uVar64;
  uVar121 = (undefined2)(uVar64 >> 0x10);
  auVar47._4_8_ = auVar171._8_8_;
  auVar47._2_2_ = uVar121;
  auVar47._0_2_ = uVar121;
  uVar9 = *(ulong *)(prim + uVar60 * 9 + 6);
  uVar121 = (undefined2)(uVar9 >> 0x30);
  auVar85._8_4_ = 0;
  auVar85._0_8_ = uVar9;
  auVar85._12_2_ = uVar121;
  auVar85._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar9 >> 0x20);
  auVar84._12_4_ = auVar85._12_4_;
  auVar84._8_2_ = 0;
  auVar84._0_8_ = uVar9;
  auVar84._10_2_ = uVar121;
  auVar83._10_6_ = auVar84._10_6_;
  auVar83._8_2_ = uVar121;
  auVar83._0_8_ = uVar9;
  uVar121 = (undefined2)(uVar9 >> 0x10);
  auVar48._4_8_ = auVar83._8_8_;
  auVar48._2_2_ = uVar121;
  auVar48._0_2_ = uVar121;
  fVar152 = (float)(auVar48._0_4_ >> 0x10);
  fVar226 = (float)(auVar83._8_4_ >> 0x10);
  uVar10 = *(ulong *)(prim + uVar60 * 0xd + 6);
  uVar121 = (undefined2)(uVar10 >> 0x30);
  auVar240._8_4_ = 0;
  auVar240._0_8_ = uVar10;
  auVar240._12_2_ = uVar121;
  auVar240._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar10 >> 0x20);
  auVar239._12_4_ = auVar240._12_4_;
  auVar239._8_2_ = 0;
  auVar239._0_8_ = uVar10;
  auVar239._10_2_ = uVar121;
  auVar238._10_6_ = auVar239._10_6_;
  auVar238._8_2_ = uVar121;
  auVar238._0_8_ = uVar10;
  uVar121 = (undefined2)(uVar10 >> 0x10);
  auVar49._4_8_ = auVar238._8_8_;
  auVar49._2_2_ = uVar121;
  auVar49._0_2_ = uVar121;
  uVar11 = *(ulong *)(prim + uVar60 * 0x12 + 6);
  uVar121 = (undefined2)(uVar11 >> 0x30);
  auVar88._8_4_ = 0;
  auVar88._0_8_ = uVar11;
  auVar88._12_2_ = uVar121;
  auVar88._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar11 >> 0x20);
  auVar87._12_4_ = auVar88._12_4_;
  auVar87._8_2_ = 0;
  auVar87._0_8_ = uVar11;
  auVar87._10_2_ = uVar121;
  auVar86._10_6_ = auVar87._10_6_;
  auVar86._8_2_ = uVar121;
  auVar86._0_8_ = uVar11;
  uVar121 = (undefined2)(uVar11 >> 0x10);
  auVar50._4_8_ = auVar86._8_8_;
  auVar50._2_2_ = uVar121;
  auVar50._0_2_ = uVar121;
  fVar166 = (float)(auVar50._0_4_ >> 0x10);
  fVar227 = (float)(auVar86._8_4_ >> 0x10);
  uVar67 = (ulong)(uint)((int)(uVar60 * 5) << 2);
  uVar12 = *(ulong *)(prim + uVar60 * 2 + uVar67 + 6);
  uVar121 = (undefined2)(uVar12 >> 0x30);
  auVar268._8_4_ = 0;
  auVar268._0_8_ = uVar12;
  auVar268._12_2_ = uVar121;
  auVar268._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar12 >> 0x20);
  auVar267._12_4_ = auVar268._12_4_;
  auVar267._8_2_ = 0;
  auVar267._0_8_ = uVar12;
  auVar267._10_2_ = uVar121;
  auVar266._10_6_ = auVar267._10_6_;
  auVar266._8_2_ = uVar121;
  auVar266._0_8_ = uVar12;
  uVar121 = (undefined2)(uVar12 >> 0x10);
  auVar51._4_8_ = auVar266._8_8_;
  auVar51._2_2_ = uVar121;
  auVar51._0_2_ = uVar121;
  uVar67 = *(ulong *)(prim + uVar67 + 6);
  uVar121 = (undefined2)(uVar67 >> 0x30);
  auVar91._8_4_ = 0;
  auVar91._0_8_ = uVar67;
  auVar91._12_2_ = uVar121;
  auVar91._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar67 >> 0x20);
  auVar90._12_4_ = auVar91._12_4_;
  auVar90._8_2_ = 0;
  auVar90._0_8_ = uVar67;
  auVar90._10_2_ = uVar121;
  auVar89._10_6_ = auVar90._10_6_;
  auVar89._8_2_ = uVar121;
  auVar89._0_8_ = uVar67;
  uVar121 = (undefined2)(uVar67 >> 0x10);
  auVar52._4_8_ = auVar89._8_8_;
  auVar52._2_2_ = uVar121;
  auVar52._0_2_ = uVar121;
  fVar169 = (float)(auVar52._0_4_ >> 0x10);
  fVar228 = (float)(auVar89._8_4_ >> 0x10);
  uVar13 = *(ulong *)(prim + uVar60 * 0x18 + 6);
  uVar121 = (undefined2)(uVar13 >> 0x30);
  auVar280._8_4_ = 0;
  auVar280._0_8_ = uVar13;
  auVar280._12_2_ = uVar121;
  auVar280._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar13 >> 0x20);
  auVar279._12_4_ = auVar280._12_4_;
  auVar279._8_2_ = 0;
  auVar279._0_8_ = uVar13;
  auVar279._10_2_ = uVar121;
  auVar278._10_6_ = auVar279._10_6_;
  auVar278._8_2_ = uVar121;
  auVar278._0_8_ = uVar13;
  uVar121 = (undefined2)(uVar13 >> 0x10);
  auVar53._4_8_ = auVar278._8_8_;
  auVar53._2_2_ = uVar121;
  auVar53._0_2_ = uVar121;
  uVar14 = *(ulong *)(prim + uVar60 * 0x1d + 6);
  uVar121 = (undefined2)(uVar14 >> 0x30);
  auVar94._8_4_ = 0;
  auVar94._0_8_ = uVar14;
  auVar94._12_2_ = uVar121;
  auVar94._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar14 >> 0x20);
  auVar93._12_4_ = auVar94._12_4_;
  auVar93._8_2_ = 0;
  auVar93._0_8_ = uVar14;
  auVar93._10_2_ = uVar121;
  auVar92._10_6_ = auVar93._10_6_;
  auVar92._8_2_ = uVar121;
  auVar92._0_8_ = uVar14;
  uVar121 = (undefined2)(uVar14 >> 0x10);
  auVar54._4_8_ = auVar92._8_8_;
  auVar54._2_2_ = uVar121;
  auVar54._0_2_ = uVar121;
  fVar186 = (float)(auVar54._0_4_ >> 0x10);
  fVar234 = (float)(auVar92._8_4_ >> 0x10);
  uVar15 = *(ulong *)(prim + uVar60 + (ulong)(byte)PVar17 * 0x20 + 6);
  uVar121 = (undefined2)(uVar15 >> 0x30);
  auVar302._8_4_ = 0;
  auVar302._0_8_ = uVar15;
  auVar302._12_2_ = uVar121;
  auVar302._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar15 >> 0x20);
  auVar301._12_4_ = auVar302._12_4_;
  auVar301._8_2_ = 0;
  auVar301._0_8_ = uVar15;
  auVar301._10_2_ = uVar121;
  auVar300._10_6_ = auVar301._10_6_;
  auVar300._8_2_ = uVar121;
  auVar300._0_8_ = uVar15;
  uVar121 = (undefined2)(uVar15 >> 0x10);
  auVar55._4_8_ = auVar300._8_8_;
  auVar55._2_2_ = uVar121;
  auVar55._0_2_ = uVar121;
  uVar16 = *(ulong *)(prim + ((ulong)(byte)PVar17 * 0x20 - uVar60) + 6);
  uVar121 = (undefined2)(uVar16 >> 0x30);
  auVar97._8_4_ = 0;
  auVar97._0_8_ = uVar16;
  auVar97._12_2_ = uVar121;
  auVar97._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar16 >> 0x20);
  auVar96._12_4_ = auVar97._12_4_;
  auVar96._8_2_ = 0;
  auVar96._0_8_ = uVar16;
  auVar96._10_2_ = uVar121;
  auVar95._10_6_ = auVar96._10_6_;
  auVar95._8_2_ = uVar121;
  auVar95._0_8_ = uVar16;
  uVar121 = (undefined2)(uVar16 >> 0x10);
  auVar56._4_8_ = auVar95._8_8_;
  auVar56._2_2_ = uVar121;
  auVar56._0_2_ = uVar121;
  fVar187 = (float)(auVar56._0_4_ >> 0x10);
  fVar235 = (float)(auVar95._8_4_ >> 0x10);
  uVar60 = *(ulong *)(prim + uVar60 * 0x23 + 6);
  uVar121 = (undefined2)(uVar60 >> 0x30);
  auVar315._8_4_ = 0;
  auVar315._0_8_ = uVar60;
  auVar315._12_2_ = uVar121;
  auVar315._14_2_ = uVar121;
  uVar121 = (undefined2)(uVar60 >> 0x20);
  auVar314._12_4_ = auVar315._12_4_;
  auVar314._8_2_ = 0;
  auVar314._0_8_ = uVar60;
  auVar314._10_2_ = uVar121;
  auVar313._10_6_ = auVar314._10_6_;
  auVar313._8_2_ = uVar121;
  auVar313._0_8_ = uVar60;
  uVar121 = (undefined2)(uVar60 >> 0x10);
  auVar57._4_8_ = auVar313._8_8_;
  auVar57._2_2_ = uVar121;
  auVar57._0_2_ = uVar121;
  auVar174._0_8_ =
       CONCAT44(((((float)(auVar47._0_4_ >> 0x10) - fVar151) * fVar288 + fVar151) - fVar334) *
                fVar123,((((float)(int)(short)uVar64 - (float)(int)(short)uVar70) * fVar288 +
                         (float)(int)(short)uVar70) - fVar329) * fVar167);
  auVar174._8_4_ =
       ((((float)(auVar171._8_4_ >> 0x10) - fVar204) * fVar288 + fVar204) - fVar336) * fVar188;
  auVar174._12_4_ =
       ((((float)(auVar172._12_4_ >> 0x10) - (float)(auVar155._12_4_ >> 0x10)) * fVar288 +
        (float)(auVar155._12_4_ >> 0x10)) - fVar338) * fVar236;
  auVar241._0_4_ =
       ((((float)(int)(short)uVar10 - (float)(int)(short)uVar9) * fVar288 + (float)(int)(short)uVar9
        ) - fVar329) * fVar167;
  auVar241._4_4_ =
       ((((float)(auVar49._0_4_ >> 0x10) - fVar152) * fVar288 + fVar152) - fVar334) * fVar123;
  auVar241._8_4_ =
       ((((float)(auVar238._8_4_ >> 0x10) - fVar226) * fVar288 + fVar226) - fVar336) * fVar188;
  auVar241._12_4_ =
       ((((float)(auVar239._12_4_ >> 0x10) - (float)(auVar84._12_4_ >> 0x10)) * fVar288 +
        (float)(auVar84._12_4_ >> 0x10)) - fVar338) * fVar236;
  auVar269._0_8_ =
       CONCAT44(((((float)(auVar51._0_4_ >> 0x10) - fVar166) * fVar288 + fVar166) - fVar273) *
                fVar124,((((float)(int)(short)uVar12 - (float)(int)(short)uVar11) * fVar288 +
                         (float)(int)(short)uVar11) - fVar265) * fVar81);
  auVar269._8_4_ =
       ((((float)(auVar266._8_4_ >> 0x10) - fVar227) * fVar288 + fVar227) - fVar274) * fVar201;
  auVar269._12_4_ =
       ((((float)(auVar267._12_4_ >> 0x10) - (float)(auVar87._12_4_ >> 0x10)) * fVar288 +
        (float)(auVar87._12_4_ >> 0x10)) - fVar328) * fVar252;
  auVar281._0_4_ =
       ((((float)(int)(short)uVar13 - (float)(int)(short)uVar67) * fVar288 +
        (float)(int)(short)uVar67) - fVar265) * fVar81;
  auVar281._4_4_ =
       ((((float)(auVar53._0_4_ >> 0x10) - fVar169) * fVar288 + fVar169) - fVar273) * fVar124;
  auVar281._8_4_ =
       ((((float)(auVar278._8_4_ >> 0x10) - fVar228) * fVar288 + fVar228) - fVar274) * fVar201;
  auVar281._12_4_ =
       ((((float)(auVar279._12_4_ >> 0x10) - (float)(auVar90._12_4_ >> 0x10)) * fVar288 +
        (float)(auVar90._12_4_ >> 0x10)) - fVar328) * fVar252;
  uVar59 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar303._0_8_ =
       CONCAT44(((((float)(auVar55._0_4_ >> 0x10) - fVar186) * fVar288 + fVar186) - fVar259) *
                fVar150,((((float)(int)(short)uVar15 - (float)(int)(short)uVar14) * fVar288 +
                         (float)(int)(short)uVar14) - fVar254) * fVar122);
  auVar303._8_4_ =
       ((((float)(auVar300._8_4_ >> 0x10) - fVar234) * fVar288 + fVar234) - fVar261) * fVar202;
  auVar303._12_4_ =
       ((((float)(auVar301._12_4_ >> 0x10) - (float)(auVar93._12_4_ >> 0x10)) * fVar288 +
        (float)(auVar93._12_4_ >> 0x10)) - fVar275) * fVar253;
  auVar316._0_4_ =
       ((((float)(int)(short)uVar60 - (float)(int)(short)uVar16) * fVar288 +
        (float)(int)(short)uVar16) - fVar254) * fVar122;
  auVar316._4_4_ =
       ((((float)(auVar57._0_4_ >> 0x10) - fVar187) * fVar288 + fVar187) - fVar259) * fVar150;
  auVar316._8_4_ =
       ((((float)(auVar313._8_4_ >> 0x10) - fVar235) * fVar288 + fVar235) - fVar261) * fVar202;
  auVar316._12_4_ =
       ((((float)(auVar314._12_4_ >> 0x10) - (float)(auVar96._12_4_ >> 0x10)) * fVar288 +
        (float)(auVar96._12_4_ >> 0x10)) - fVar275) * fVar253;
  auVar153._8_4_ = auVar174._8_4_;
  auVar153._0_8_ = auVar174._0_8_;
  auVar153._12_4_ = auVar174._12_4_;
  auVar154 = minps(auVar153,auVar241);
  auVar134._8_4_ = auVar269._8_4_;
  auVar134._0_8_ = auVar269._0_8_;
  auVar134._12_4_ = auVar269._12_4_;
  auVar82 = minps(auVar134,auVar281);
  auVar154 = maxps(auVar154,auVar82);
  auVar135._8_4_ = auVar303._8_4_;
  auVar135._0_8_ = auVar303._0_8_;
  auVar135._12_4_ = auVar303._12_4_;
  auVar82 = minps(auVar135,auVar316);
  auVar98._4_4_ = uVar59;
  auVar98._0_4_ = uVar59;
  auVar98._8_4_ = uVar59;
  auVar98._12_4_ = uVar59;
  auVar82 = maxps(auVar82,auVar98);
  auVar82 = maxps(auVar154,auVar82);
  auVar154 = maxps(auVar174,auVar241);
  auVar270 = maxps(auVar269,auVar281);
  auVar154 = minps(auVar154,auVar270);
  auVar270 = maxps(auVar303,auVar316);
  uVar59 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar99._4_4_ = uVar59;
  auVar99._0_4_ = uVar59;
  auVar99._8_4_ = uVar59;
  auVar99._12_4_ = uVar59;
  auVar270 = minps(auVar270,auVar99);
  local_188 = auVar82._0_4_ * 0.99999964;
  fStack_184 = auVar82._4_4_ * 0.99999964;
  fStack_180 = auVar82._8_4_ * 0.99999964;
  fStack_17c = auVar82._12_4_ * 0.99999964;
  auVar82 = minps(auVar154,auVar270);
  uVar75 = (uint)(byte)PVar17;
  auVar100._0_4_ = -(uint)(local_188 <= auVar82._0_4_ * 1.0000004 && uVar75 != 0);
  auVar100._4_4_ = -(uint)(fStack_184 <= auVar82._4_4_ * 1.0000004 && 1 < uVar75);
  auVar100._8_4_ = -(uint)(fStack_180 <= auVar82._8_4_ * 1.0000004 && 2 < uVar75);
  auVar100._12_4_ = -(uint)(fStack_17c <= auVar82._12_4_ * 1.0000004 && 3 < uVar75);
  uVar75 = movmskps(uVar75,auVar100);
  local_699 = uVar75 != 0;
  if (uVar75 == 0) {
    return local_699;
  }
  uVar75 = uVar75 & 0xff;
  local_168._0_12_ = mm_lookupmask_ps._240_12_;
  local_168._12_4_ = 0;
  local_418 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_348 = prim;
LAB_00c2445f:
  local_340 = (ulong)uVar75;
  lVar72 = 0;
  if (local_340 != 0) {
    for (; (uVar75 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
    }
  }
  uVar75 = *(uint *)(local_348 + 2);
  uVar70 = (ulong)uVar75;
  uVar76 = *(uint *)(local_348 + lVar72 * 4 + 6);
  pGVar18 = (context->scene->geometries).items[uVar70].ptr;
  uVar64 = (ulong)*(uint *)(*(long *)&pGVar18->field_0x58 +
                           (ulong)uVar76 *
                           pGVar18[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar167 = pGVar18->fnumTimeSegments;
  fVar81 = (pGVar18->time_range).lower;
  fVar122 = ((*(float *)(ray + k * 4 + 0x70) - fVar81) / ((pGVar18->time_range).upper - fVar81)) *
            fVar167;
  fVar81 = floorf(fVar122);
  fVar167 = fVar167 + -1.0;
  if (fVar167 <= fVar81) {
    fVar81 = fVar167;
  }
  fVar167 = 0.0;
  if (0.0 <= fVar81) {
    fVar167 = fVar81;
  }
  fVar122 = fVar122 - fVar167;
  fVar81 = 1.0 - fVar122;
  _Var19 = pGVar18[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar68 = (long)(int)fVar167 * 0x38;
  lVar72 = *(long *)(_Var19 + lVar68);
  lVar61 = *(long *)(_Var19 + 0x10 + lVar68);
  pfVar1 = (float *)(lVar72 + lVar61 * uVar64);
  pfVar2 = (float *)(lVar72 + lVar61 * (uVar64 + 1));
  pfVar3 = (float *)(lVar72 + lVar61 * (uVar64 + 2));
  pRVar73 = (RTCFilterFunctionNArguments *)(lVar61 * (uVar64 + 3));
  pfVar4 = (float *)((long)&pRVar73->valid + lVar72);
  lVar72 = *(long *)(_Var19 + 0x38 + lVar68);
  lVar61 = *(long *)(_Var19 + 0x48 + lVar68);
  pRVar66 = (RTCIntersectArguments *)((uVar64 + 1) * lVar61);
  pfVar5 = (float *)(lVar72 + uVar64 * lVar61);
  pfVar6 = (float *)((long)&pRVar66->flags + lVar72);
  pfVar7 = (float *)(lVar72 + (uVar64 + 2) * lVar61);
  fVar169 = *pfVar1 * fVar81 + *pfVar5 * fVar122;
  fVar186 = pfVar1[1] * fVar81 + pfVar5[1] * fVar122;
  fVar187 = pfVar1[2] * fVar81 + pfVar5[2] * fVar122;
  local_4e8 = *pfVar2 * fVar81 + *pfVar6 * fVar122;
  fStack_4e4 = pfVar2[1] * fVar81 + pfVar6[1] * fVar122;
  fStack_4e0 = pfVar2[2] * fVar81 + pfVar6[2] * fVar122;
  fStack_11c = *(float *)(ray + k * 4 + 0x40);
  fVar167 = *(float *)(ray + k * 4 + 0x50);
  fVar123 = *(float *)(ray + k * 4 + 0x60);
  local_3c8._4_4_ = fVar167;
  local_3c8._0_4_ = fStack_11c;
  fStack_3c0 = fVar123;
  fStack_3bc = 0.0;
  fVar124 = fVar167 * fVar167;
  fVar150 = fVar123 * fVar123;
  fVar201 = fVar124 + fStack_11c * fStack_11c + fVar150;
  local_3e8._0_8_ = CONCAT44(fVar124 + fVar124 + 0.0,fVar201);
  local_3e8._8_4_ = fVar124 + fVar150 + fVar150;
  local_3e8._12_4_ = fVar124 + 0.0 + 0.0;
  auVar221._8_4_ = local_3e8._8_4_;
  auVar221._0_8_ = local_3e8._0_8_;
  auVar221._12_4_ = local_3e8._12_4_;
  auVar82 = rcpss(auVar221,local_3e8);
  local_3d8 = (2.0 - fVar201 * auVar82._0_4_) * auVar82._0_4_ *
              (((fVar187 + fStack_4e0) * 0.5 - *(float *)(ray + k * 4 + 0x20)) * fVar123 +
              ((fVar186 + fStack_4e4) * 0.5 - *(float *)(ray + k * 4 + 0x10)) * fVar167 +
              ((fVar169 + local_4e8) * 0.5 - *(float *)(ray + k * 4)) * fStack_11c);
  fStack_3d4 = local_3d8;
  fStack_3d0 = local_3d8;
  fStack_3cc = local_3d8;
  local_618._0_4_ = fStack_11c * local_3d8 + *(float *)(ray + k * 4);
  local_618._4_4_ = fVar167 * local_3d8 + *(float *)(ray + k * 4 + 0x10);
  fStack_610 = fVar123 * local_3d8 + *(float *)(ray + k * 4 + 0x20);
  fVar169 = fVar169 - (float)local_618._0_4_;
  fVar186 = fVar186 - (float)local_618._4_4_;
  fVar187 = fVar187 - fStack_610;
  fVar188 = (pfVar1[3] * fVar81 + pfVar5[3] * fVar122) - 0.0;
  local_4f8 = (*pfVar3 * fVar81 + *pfVar7 * fVar122) - (float)local_618._0_4_;
  fStack_4f4 = (pfVar3[1] * fVar81 + pfVar7[1] * fVar122) - (float)local_618._4_4_;
  fStack_4f0 = (pfVar3[2] * fVar81 + pfVar7[2] * fVar122) - fStack_610;
  fStack_4ec = (pfVar3[3] * fVar81 + pfVar7[3] * fVar122) - 0.0;
  pfVar1 = (float *)(lVar72 + lVar61 * (uVar64 + 3));
  local_4e8 = local_4e8 - (float)local_618._0_4_;
  fStack_4e4 = fStack_4e4 - (float)local_618._4_4_;
  fStack_4e0 = fStack_4e0 - fStack_610;
  fStack_4dc = (pfVar2[3] * fVar81 + pfVar6[3] * fVar122) - 0.0;
  local_618._0_4_ = (fVar122 * *pfVar1 + fVar81 * *pfVar4) - (float)local_618._0_4_;
  local_618._4_4_ = (fVar122 * pfVar1[1] + fVar81 * pfVar4[1]) - (float)local_618._4_4_;
  fStack_610 = (fVar122 * pfVar1[2] + fVar81 * pfVar4[2]) - fStack_610;
  fStack_60c = (fVar122 * pfVar1[3] + fVar81 * pfVar4[3]) - 0.0;
  local_248 = fVar169;
  fStack_244 = fVar169;
  fStack_240 = fVar169;
  fStack_23c = fVar169;
  local_138 = fVar186;
  fStack_134 = fVar186;
  fStack_130 = fVar186;
  fStack_12c = fVar186;
  local_148 = fVar187;
  fStack_144 = fVar187;
  fStack_140 = fVar187;
  fStack_13c = fVar187;
  local_258 = fVar188;
  fStack_254 = fVar188;
  fStack_250 = fVar188;
  fStack_24c = fVar188;
  fVar81 = fVar167 * fVar167;
  local_268 = local_4e8;
  fStack_264 = local_4e8;
  fStack_260 = local_4e8;
  fStack_25c = local_4e8;
  fStack_11c = fStack_11c * fStack_11c;
  local_128 = fStack_11c + fVar81 + fVar150;
  fStack_124 = fStack_11c + fVar81 + fVar150;
  fStack_120 = fStack_11c + fVar81 + fVar150;
  fStack_11c = fStack_11c + fVar81 + fVar150;
  local_278 = fStack_4e4;
  fStack_274 = fStack_4e4;
  fStack_270 = fStack_4e4;
  fStack_26c = fStack_4e4;
  local_288 = fStack_4e0;
  fStack_284 = fStack_4e0;
  fStack_280 = fStack_4e0;
  fStack_27c = fStack_4e0;
  local_298 = fStack_4dc;
  fStack_294 = fStack_4dc;
  fStack_290 = fStack_4dc;
  fStack_28c = fStack_4dc;
  local_2a8 = fStack_4f4;
  fStack_2a4 = fStack_4f4;
  fStack_2a0 = fStack_4f4;
  fStack_29c = fStack_4f4;
  local_2b8 = fStack_4f0;
  fStack_2b4 = fStack_4f0;
  fStack_2b0 = fStack_4f0;
  fStack_2ac = fStack_4f0;
  local_2c8 = fStack_4ec;
  fStack_2c4 = fStack_4ec;
  fStack_2c0 = fStack_4ec;
  fStack_2bc = fStack_4ec;
  local_2d8 = fStack_610;
  fStack_2d4 = fStack_610;
  fStack_2d0 = fStack_610;
  fStack_2cc = fStack_610;
  local_2e8 = fStack_60c;
  fStack_2e4 = fStack_60c;
  fStack_2e0 = fStack_60c;
  fStack_2dc = fStack_60c;
  local_478 = *(float *)(ray + k * 4 + 0x40);
  fStack_474 = local_478;
  fStack_470 = local_478;
  fStack_46c = local_478;
  local_318 = ABS(local_128);
  fStack_314 = ABS(fStack_124);
  fStack_310 = ABS(fStack_120);
  fStack_30c = ABS(fStack_11c);
  fVar81 = *(float *)(ray + k * 4 + 0x30);
  local_378 = ZEXT416((uint)local_3d8);
  local_158 = fVar81 - local_3d8;
  fStack_154 = local_158;
  fStack_150 = local_158;
  fStack_14c = local_158;
  local_410 = uVar70;
  local_328 = uVar75;
  uStack_324 = uVar75;
  uStack_320 = uVar75;
  uStack_31c = uVar75;
  local_338 = uVar76;
  uStack_334 = uVar76;
  uStack_330 = uVar76;
  uStack_32c = uVar76;
  uVar75 = 0;
  bVar74 = 0;
  lVar61 = 1;
  local_510 = (RTCFilterFunctionNArguments *)0x1;
  fVar122 = 0.0;
  fVar124 = 1.0;
  uVar59 = 0;
  uVar168 = 0;
  local_2f8 = local_4f8;
  fStack_2f4 = local_4f8;
  fStack_2f0 = local_4f8;
  fStack_2ec = local_4f8;
  local_308 = (float)local_618._0_4_;
  fStack_304 = (float)local_618._0_4_;
  fStack_300 = (float)local_618._0_4_;
  fStack_2fc = (float)local_618._0_4_;
  local_3f8 = (float)local_618._4_4_;
  fStack_3f4 = (float)local_618._4_4_;
  fStack_3f0 = (float)local_618._4_4_;
  fStack_3ec = (float)local_618._4_4_;
  fVar150 = (float)local_618._4_4_;
  fVar151 = (float)local_618._4_4_;
  fVar152 = (float)local_618._4_4_;
  fVar166 = (float)local_618._4_4_;
  do {
    local_5c8._4_4_ = fVar124 - fVar122;
    local_488 = fVar122;
    fStack_484 = fVar124;
    uStack_480 = uVar59;
    uStack_47c = uVar168;
    local_5c8._0_4_ = local_5c8._4_4_;
    fStack_5c0 = (float)local_5c8._4_4_;
    fStack_5bc = (float)local_5c8._4_4_;
    local_448 = fVar122;
    fStack_444 = fVar122;
    fStack_440 = fVar122;
    fStack_43c = fVar122;
    fVar234 = (float)local_5c8._4_4_ * 0.0 + fVar122;
    fVar236 = (float)local_5c8._4_4_ * 0.33333334 + fVar122;
    fVar253 = (float)local_5c8._4_4_ * 0.6666667 + fVar122;
    fVar273 = (float)local_5c8._4_4_ * 1.0 + fVar122;
    fVar324 = 1.0 - fVar234;
    fVar329 = 1.0 - fVar236;
    fVar334 = 1.0 - fVar253;
    fVar263 = 1.0 - fVar273;
    fVar204 = fVar234 * 3.0;
    fVar226 = fVar236 * 3.0;
    fVar227 = fVar253 * 3.0;
    fVar228 = fVar273 * 3.0;
    fVar328 = ((fVar324 * 3.0 + -5.0) * fVar324 * fVar324 + 2.0) * 0.5;
    fVar254 = ((fVar329 * 3.0 + -5.0) * fVar329 * fVar329 + 2.0) * 0.5;
    fVar336 = ((fVar334 * 3.0 + -5.0) * fVar334 * fVar334 + 2.0) * 0.5;
    fVar338 = ((fVar263 * 3.0 + -5.0) * fVar263 * fVar263 + 2.0) * 0.5;
    fVar235 = -fVar324 * fVar234 * fVar234 * 0.5;
    fVar265 = -fVar329 * fVar236 * fVar236 * 0.5;
    fVar259 = -fVar334 * fVar253 * fVar253 * 0.5;
    fVar318 = -fVar263 * fVar273 * fVar273 * 0.5;
    fVar276 = (fVar234 * fVar234 * (fVar204 + -5.0) + 2.0) * 0.5;
    fVar289 = (fVar236 * fVar236 * (fVar226 + -5.0) + 2.0) * 0.5;
    fVar293 = (fVar253 * fVar253 * (fVar227 + -5.0) + 2.0) * 0.5;
    fVar295 = (fVar273 * fVar273 * (fVar228 + -5.0) + 2.0) * 0.5;
    fVar202 = (float)local_5c8._4_4_ * 0.11111111;
    fVar252 = -fVar234 * fVar324 * fVar324 * 0.5;
    fVar274 = -fVar236 * fVar329 * fVar329 * 0.5;
    fVar309 = -fVar253 * fVar334 * fVar334 * 0.5;
    fVar320 = -fVar273 * fVar263 * fVar263 * 0.5;
    fVar344 = local_248 * fVar252 + local_268 * fVar276 + local_2f8 * fVar328 + local_308 * fVar235;
    fVar348 = fStack_244 * fVar274 +
              fStack_264 * fVar289 + fStack_2f4 * fVar254 + fStack_304 * fVar265;
    fVar349 = fStack_240 * fVar309 +
              fStack_260 * fVar293 + fStack_2f0 * fVar336 + fStack_300 * fVar259;
    fVar350 = fStack_23c * fVar320 +
              fStack_25c * fVar295 + fStack_2ec * fVar338 + fStack_2fc * fVar318;
    fVar261 = local_138 * fVar252 + local_278 * fVar276 + local_2a8 * fVar328 + fVar150 * fVar235;
    fVar288 = fStack_134 * fVar274 + fStack_274 * fVar289 + fStack_2a4 * fVar254 + fVar151 * fVar265
    ;
    fVar298 = fStack_130 * fVar309 + fStack_270 * fVar293 + fStack_2a0 * fVar336 + fVar152 * fVar259
    ;
    fVar306 = fStack_12c * fVar320 + fStack_26c * fVar295 + fStack_29c * fVar338 + fVar166 * fVar318
    ;
    fVar275 = local_148 * fVar252 + local_288 * fVar276 + local_2b8 * fVar328 + local_2d8 * fVar235;
    fVar292 = fStack_144 * fVar274 +
              fStack_284 * fVar289 + fStack_2b4 * fVar254 + fStack_2d4 * fVar265;
    fVar305 = fStack_140 * fVar309 +
              fStack_280 * fVar293 + fStack_2b0 * fVar336 + fStack_2d0 * fVar259;
    fVar307 = fStack_13c * fVar320 +
              fStack_27c * fVar295 + fStack_2ac * fVar338 + fStack_2cc * fVar318;
    fVar328 = fVar252 * local_258 + fVar276 * local_298 + fVar328 * local_2c8 + fVar235 * local_2e8;
    fVar254 = fVar274 * fStack_254 +
              fVar289 * fStack_294 + fVar254 * fStack_2c4 + fVar265 * fStack_2e4;
    auVar222._0_8_ = CONCAT44(fVar254,fVar328);
    auVar222._8_4_ =
         fVar309 * fStack_250 + fVar293 * fStack_290 + fVar336 * fStack_2c0 + fVar259 * fStack_2e0;
    auVar222._12_4_ =
         fVar320 * fStack_24c + fVar295 * fStack_28c + fVar338 * fStack_2bc + fVar318 * fStack_2dc;
    fVar259 = fVar234 * (fVar324 + fVar324);
    fVar318 = fVar236 * (fVar329 + fVar329);
    fVar336 = fVar253 * (fVar334 + fVar334);
    fVar276 = fVar273 * (fVar263 + fVar263);
    fVar309 = (fVar259 - fVar324 * fVar324) * 0.5;
    fVar320 = (fVar318 - fVar329 * fVar329) * 0.5;
    fVar338 = (fVar336 - fVar334 * fVar334) * 0.5;
    fVar289 = (fVar276 - fVar263 * fVar263) * 0.5;
    fVar235 = (fVar234 * fVar204 + (fVar234 + fVar234) * (fVar204 + -5.0)) * 0.5;
    fVar252 = (fVar236 * fVar226 + (fVar236 + fVar236) * (fVar226 + -5.0)) * 0.5;
    fVar265 = (fVar253 * fVar227 + (fVar253 + fVar253) * (fVar227 + -5.0)) * 0.5;
    fVar274 = (fVar273 * fVar228 + (fVar273 + fVar273) * (fVar228 + -5.0)) * 0.5;
    fVar166 = ((fVar204 + 2.0) * (fVar324 + fVar324) - fVar324 * 3.0 * fVar324) * 0.5;
    fVar150 = ((fVar226 + 2.0) * (fVar329 + fVar329) - fVar329 * 3.0 * fVar329) * 0.5;
    fVar151 = ((fVar227 + 2.0) * (fVar334 + fVar334) - fVar334 * 3.0 * fVar334) * 0.5;
    fVar152 = ((fVar228 + 2.0) * (fVar263 + fVar263) - fVar263 * 3.0 * fVar263) * 0.5;
    fVar204 = (fVar234 * fVar234 - fVar259) * 0.5;
    fVar226 = (fVar236 * fVar236 - fVar318) * 0.5;
    fVar227 = (fVar253 * fVar253 - fVar336) * 0.5;
    fVar228 = (fVar273 * fVar273 - fVar276) * 0.5;
    fVar330 = (local_248 * fVar309 + local_268 * fVar235 + local_2f8 * fVar166 + local_308 * fVar204
              ) * fVar202;
    local_428 = (fStack_244 * fVar320 +
                fStack_264 * fVar252 + fStack_2f4 * fVar150 + fStack_304 * fVar226) * fVar202;
    fStack_424 = (fStack_240 * fVar338 +
                 fStack_260 * fVar265 + fStack_2f0 * fVar151 + fStack_300 * fVar227) * fVar202;
    fStack_420 = (fStack_23c * fVar289 +
                 fStack_25c * fVar274 + fStack_2ec * fVar152 + fStack_2fc * fVar228) * fVar202;
    fVar263 = (local_138 * fVar309 + local_278 * fVar235 + local_2a8 * fVar166 + local_3f8 * fVar204
              ) * fVar202;
    fVar293 = (fStack_134 * fVar320 +
              fStack_274 * fVar252 + fStack_2a4 * fVar150 + fStack_3f4 * fVar226) * fVar202;
    fVar295 = (fStack_130 * fVar338 +
              fStack_270 * fVar265 + fStack_2a0 * fVar151 + fStack_3f0 * fVar227) * fVar202;
    fVar308 = (fStack_12c * fVar289 +
              fStack_26c * fVar274 + fStack_29c * fVar152 + fStack_3ec * fVar228) * fVar202;
    fVar310 = (local_148 * fVar309 + local_288 * fVar235 + local_2b8 * fVar166 + local_2d8 * fVar204
              ) * fVar202;
    fVar319 = (fStack_144 * fVar320 +
              fStack_284 * fVar252 + fStack_2b4 * fVar150 + fStack_2d4 * fVar226) * fVar202;
    fVar321 = (fStack_140 * fVar338 +
              fStack_280 * fVar265 + fStack_2b0 * fVar151 + fStack_2d0 * fVar227) * fVar202;
    fVar325 = (fStack_13c * fVar289 +
              fStack_27c * fVar274 + fStack_2ac * fVar152 + fStack_2cc * fVar228) * fVar202;
    fVar150 = fVar202 * (fVar320 * fStack_254 +
                        fVar252 * fStack_294 + fVar150 * fStack_2c4 + fVar226 * fStack_2e4);
    fVar151 = fVar202 * (fVar338 * fStack_250 +
                        fVar265 * fStack_290 + fVar151 * fStack_2c0 + fVar227 * fStack_2e0);
    fVar152 = fVar202 * (fVar289 * fStack_24c +
                        fVar274 * fStack_28c + fVar152 * fStack_2bc + fVar228 * fStack_2dc);
    auVar175._4_4_ = auVar222._8_4_;
    auVar175._0_4_ = fVar254;
    auVar175._8_4_ = auVar222._12_4_;
    auVar175._12_4_ = 0;
    auVar230._0_4_ =
         fVar328 + fVar202 * (fVar309 * local_258 +
                             fVar235 * local_298 + fVar166 * local_2c8 + fVar204 * local_2e8);
    auVar230._4_4_ = fVar254 + fVar150;
    auVar230._8_4_ = auVar222._8_4_ + fVar151;
    auVar230._12_4_ = auVar222._12_4_ + fVar152;
    auVar256._0_8_ = CONCAT44(auVar222._8_4_ - fVar151,fVar254 - fVar150);
    auVar256._8_4_ = auVar222._12_4_ - fVar152;
    auVar256._12_4_ = 0;
    local_458 = fVar288 - fVar261;
    fStack_454 = fVar298 - fVar288;
    fStack_450 = fVar306 - fVar298;
    fStack_44c = 0.0 - fVar306;
    fVar252 = fVar292 - fVar275;
    fVar265 = fVar305 - fVar292;
    fVar274 = fVar307 - fVar305;
    fVar254 = 0.0 - fVar307;
    fVar150 = fVar263 * fVar252 - fVar310 * local_458;
    fVar151 = fVar293 * fVar265 - fVar319 * fStack_454;
    fVar152 = fVar295 * fVar274 - fVar321 * fStack_450;
    fVar166 = fVar308 * fVar254 - fVar325 * fStack_44c;
    local_468 = fVar348 - fVar344;
    fStack_464 = fVar349 - fVar348;
    fStack_460 = fVar350 - fVar349;
    fStack_45c = 0.0 - fVar350;
    fVar228 = fVar310 * local_468 - fVar330 * fVar252;
    fVar234 = fVar319 * fStack_464 - local_428 * fVar265;
    fVar235 = fVar321 * fStack_460 - fStack_424 * fVar274;
    fVar236 = fVar325 * fStack_45c - fStack_420 * fVar254;
    fVar253 = fVar330 * local_458 - fVar263 * local_468;
    fVar273 = local_428 * fStack_454 - fVar293 * fStack_464;
    fVar328 = fStack_424 * fStack_450 - fVar295 * fStack_460;
    fVar259 = fStack_420 * fStack_44c - fVar308 * fStack_45c;
    auVar242._0_4_ = local_458 * local_458 + fVar252 * fVar252;
    auVar242._4_4_ = fStack_454 * fStack_454 + fVar265 * fVar265;
    auVar242._8_4_ = fStack_450 * fStack_450 + fVar274 * fVar274;
    auVar242._12_4_ = fStack_44c * fStack_44c + fVar254 * fVar254;
    auVar271._0_4_ = local_468 * local_468 + auVar242._0_4_;
    auVar271._4_4_ = fStack_464 * fStack_464 + auVar242._4_4_;
    auVar271._8_4_ = fStack_460 * fStack_460 + auVar242._8_4_;
    auVar271._12_4_ = fStack_45c * fStack_45c + auVar242._12_4_;
    auVar82 = rcpps(auVar242,auVar271);
    fVar202 = auVar82._0_4_;
    fVar204 = auVar82._4_4_;
    fVar226 = auVar82._8_4_;
    fVar227 = auVar82._12_4_;
    fVar202 = (1.0 - fVar202 * auVar271._0_4_) * fVar202 + fVar202;
    fVar204 = (1.0 - fVar204 * auVar271._4_4_) * fVar204 + fVar204;
    fVar226 = (1.0 - fVar226 * auVar271._8_4_) * fVar226 + fVar226;
    fVar227 = (1.0 - fVar227 * auVar271._12_4_) * fVar227 + fVar227;
    fVar309 = fVar252 * fVar293 - local_458 * fVar319;
    fVar318 = fVar265 * fVar295 - fStack_454 * fVar321;
    fVar320 = fVar274 * fVar308 - fStack_450 * fVar325;
    fVar324 = fVar254 * 0.0 - fStack_44c * 0.0;
    fVar329 = local_468 * fVar319 - fVar252 * local_428;
    fVar334 = fStack_464 * fVar321 - fVar265 * fStack_424;
    fVar336 = fStack_460 * fVar325 - fVar274 * fStack_420;
    fVar338 = fStack_45c * 0.0 - fVar254 * 0.0;
    uStack_41c = 0;
    fVar276 = local_458 * local_428 - local_468 * fVar293;
    fVar289 = fStack_454 * fStack_424 - fStack_464 * fVar295;
    fVar322 = fStack_450 * fStack_420 - fStack_460 * fVar308;
    fVar326 = fStack_44c * 0.0 - fStack_45c * 0.0;
    auVar136._0_4_ = (fVar150 * fVar150 + fVar228 * fVar228 + fVar253 * fVar253) * fVar202;
    auVar136._4_4_ = (fVar151 * fVar151 + fVar234 * fVar234 + fVar273 * fVar273) * fVar204;
    auVar136._8_4_ = (fVar152 * fVar152 + fVar235 * fVar235 + fVar328 * fVar328) * fVar226;
    auVar136._12_4_ = (fVar166 * fVar166 + fVar236 * fVar236 + fVar259 * fVar259) * fVar227;
    auVar282._0_4_ = (fVar309 * fVar309 + fVar329 * fVar329 + fVar276 * fVar276) * fVar202;
    auVar282._4_4_ = (fVar318 * fVar318 + fVar334 * fVar334 + fVar289 * fVar289) * fVar204;
    auVar282._8_4_ = (fVar320 * fVar320 + fVar336 * fVar336 + fVar322 * fVar322) * fVar226;
    auVar282._12_4_ = (fVar324 * fVar324 + fVar338 * fVar338 + fVar326 * fVar326) * fVar227;
    auVar82 = maxps(auVar136,auVar282);
    auVar243._8_4_ = auVar222._8_4_;
    auVar243._0_8_ = auVar222._0_8_;
    auVar243._12_4_ = auVar222._12_4_;
    auVar270 = maxps(auVar243,auVar230);
    auVar190._8_4_ = auVar256._8_4_;
    auVar190._0_8_ = auVar256._0_8_;
    auVar190._12_4_ = 0;
    auVar154 = maxps(auVar190,auVar175);
    auVar244 = maxps(auVar270,auVar154);
    auVar154 = minps(auVar222,auVar230);
    auVar270 = minps(auVar256,auVar175);
    auVar270 = minps(auVar154,auVar270);
    auVar82 = sqrtps(auVar82,auVar82);
    auVar154 = rsqrtps(auVar82,auVar271);
    fVar150 = auVar154._0_4_;
    fVar151 = auVar154._4_4_;
    fVar152 = auVar154._8_4_;
    fVar166 = auVar154._12_4_;
    fVar322 = fVar150 * 1.5 - fVar150 * fVar150 * auVar271._0_4_ * 0.5 * fVar150;
    fVar326 = fVar151 * 1.5 - fVar151 * fVar151 * auVar271._4_4_ * 0.5 * fVar151;
    uVar311 = CONCAT44(fVar326,fVar322);
    fVar323 = fVar152 * 1.5 - fVar152 * fVar152 * auVar271._8_4_ * 0.5 * fVar152;
    fVar327 = fVar166 * 1.5 - fVar166 * fVar166 * auVar271._12_4_ * 0.5 * fVar166;
    fVar331 = 0.0 - fVar261;
    fVar335 = 0.0 - fVar288;
    fVar337 = 0.0 - fVar298;
    fVar339 = 0.0 - fVar306;
    local_438 = 0.0 - fVar275;
    fStack_434 = 0.0 - fVar292;
    fStack_430 = 0.0 - fVar305;
    fStack_42c = 0.0 - fVar307;
    fVar329 = 0.0 - fVar344;
    fVar334 = 0.0 - fVar348;
    fVar336 = 0.0 - fVar349;
    fVar338 = 0.0 - fVar350;
    auVar340._8_4_ = fVar323;
    auVar340._0_8_ = uVar311;
    auVar340._12_4_ = fVar327;
    fVar253 = local_478 * local_468 * fVar322 +
              fVar167 * local_458 * fVar322 + fVar123 * fVar252 * fVar322;
    fVar273 = fStack_474 * fStack_464 * fVar326 +
              fVar167 * fStack_454 * fVar326 + fVar123 * fVar265 * fVar326;
    fVar328 = fStack_470 * fStack_460 * fVar323 +
              fVar167 * fStack_450 * fVar323 + fVar123 * fVar274 * fVar323;
    fVar259 = fStack_46c * fStack_45c * fVar327 +
              fVar167 * fStack_44c * fVar327 + fVar123 * fVar254 * fVar327;
    fVar202 = local_468 * fVar322 * fVar329 +
              local_458 * fVar322 * fVar331 + fVar252 * fVar322 * local_438;
    fVar226 = fStack_464 * fVar326 * fVar334 +
              fStack_454 * fVar326 * fVar335 + fVar265 * fVar326 * fStack_434;
    fVar228 = fStack_460 * fVar323 * fVar336 +
              fStack_450 * fVar323 * fVar337 + fVar274 * fVar323 * fStack_430;
    fVar235 = fStack_45c * fVar327 * fVar338 +
              fStack_44c * fVar327 * fVar339 + fVar254 * fVar327 * fStack_42c;
    local_508._0_4_ =
         (local_478 * fVar329 + fVar167 * fVar331 + fVar123 * local_438) - fVar253 * fVar202;
    local_508._4_4_ =
         (fStack_474 * fVar334 + fVar167 * fVar335 + fVar123 * fStack_434) - fVar273 * fVar226;
    fStack_500 = (fStack_470 * fVar336 + fVar167 * fVar337 + fVar123 * fStack_430) -
                 fVar328 * fVar228;
    fStack_4fc = (fStack_46c * fVar338 + fVar167 * fVar339 + fVar123 * fStack_42c) -
                 fVar259 * fVar235;
    fVar204 = (fVar329 * fVar329 + fVar331 * fVar331 + local_438 * local_438) - fVar202 * fVar202;
    fVar227 = (fVar334 * fVar334 + fVar335 * fVar335 + fStack_434 * fStack_434) - fVar226 * fVar226;
    fVar234 = (fVar336 * fVar336 + fVar337 * fVar337 + fStack_430 * fStack_430) - fVar228 * fVar228;
    fVar236 = (fVar338 * fVar338 + fVar339 * fVar339 + fStack_42c * fStack_42c) - fVar235 * fVar235;
    fVar150 = (auVar244._0_4_ + auVar82._0_4_) * 1.0000002;
    fVar151 = (auVar244._4_4_ + auVar82._4_4_) * 1.0000002;
    fVar152 = (auVar244._8_4_ + auVar82._8_4_) * 1.0000002;
    fVar166 = (auVar244._12_4_ + auVar82._12_4_) * 1.0000002;
    fVar276 = fVar204 - fVar150 * fVar150;
    fVar289 = fVar227 - fVar151 * fVar151;
    fVar152 = fVar234 - fVar152 * fVar152;
    fVar166 = fVar236 - fVar166 * fVar166;
    fVar150 = fVar253 * fVar253;
    fVar151 = fVar273 * fVar273;
    local_498 = CONCAT44(fVar151,fVar150);
    fStack_490 = fVar328 * fVar328;
    fStack_48c = fVar259 * fVar259;
    auVar345._0_4_ = local_128 - fVar150;
    auVar345._4_4_ = fStack_124 - fVar151;
    auVar345._8_4_ = fStack_120 - fStack_490;
    auVar345._12_4_ = fStack_11c - fStack_48c;
    local_508._0_4_ = (float)local_508._0_4_ + (float)local_508._0_4_;
    local_508._4_4_ = (float)local_508._4_4_ + (float)local_508._4_4_;
    fStack_500 = fStack_500 + fStack_500;
    fStack_4fc = fStack_4fc + fStack_4fc;
    fVar309 = auVar345._0_4_ * 4.0;
    fVar318 = auVar345._4_4_ * 4.0;
    fVar320 = auVar345._8_4_ * 4.0;
    fVar324 = auVar345._12_4_ * 4.0;
    auVar245._0_4_ = (float)local_508._0_4_ * (float)local_508._0_4_ - fVar309 * fVar276;
    auVar245._4_4_ = (float)local_508._4_4_ * (float)local_508._4_4_ - fVar318 * fVar289;
    auVar245._8_4_ = fStack_500 * fStack_500 - fVar320 * fVar152;
    auVar245._12_4_ = fStack_4fc * fStack_4fc - fVar324 * fVar166;
    auVar176._4_4_ = -(uint)(0.0 <= auVar245._4_4_);
    auVar176._0_4_ = -(uint)(0.0 <= auVar245._0_4_);
    auVar176._8_4_ = -(uint)(0.0 <= auVar245._8_4_);
    auVar176._12_4_ = -(uint)(0.0 <= auVar245._12_4_);
    uVar65 = (undefined4)((ulong)lVar61 >> 0x20);
    iVar58 = movmskps((int)lVar61,auVar176);
    if (iVar58 == 0) {
      auVar101._8_4_ = fVar323;
      auVar101._0_8_ = uVar311;
      auVar101._12_4_ = fVar327;
      iVar58 = 0;
      auVar192 = _DAT_01feb9f0;
      auVar283 = _DAT_01feba00;
    }
    else {
      auVar244 = sqrtps(auVar340,auVar245);
      bVar20 = 0.0 <= auVar245._0_4_;
      uVar76 = -(uint)bVar20;
      bVar21 = 0.0 <= auVar245._4_4_;
      uVar77 = -(uint)bVar21;
      bVar22 = 0.0 <= auVar245._8_4_;
      uVar78 = -(uint)bVar22;
      bVar23 = 0.0 <= auVar245._12_4_;
      uVar79 = -(uint)bVar23;
      auVar191._0_4_ = auVar345._0_4_ + auVar345._0_4_;
      auVar191._4_4_ = auVar345._4_4_ + auVar345._4_4_;
      auVar191._8_4_ = auVar345._8_4_ + auVar345._8_4_;
      auVar191._12_4_ = auVar345._12_4_ + auVar345._12_4_;
      auVar154 = rcpps(_local_498,auVar191);
      fVar277 = auVar154._0_4_;
      fVar290 = auVar154._4_4_;
      fVar294 = auVar154._8_4_;
      fVar296 = auVar154._12_4_;
      fVar277 = (1.0 - auVar191._0_4_ * fVar277) * fVar277 + fVar277;
      fVar290 = (1.0 - auVar191._4_4_ * fVar290) * fVar290 + fVar290;
      fVar294 = (1.0 - auVar191._8_4_ * fVar294) * fVar294 + fVar294;
      fVar296 = (1.0 - auVar191._12_4_ * fVar296) * fVar296 + fVar296;
      fVar255 = (-(float)local_508._0_4_ - auVar244._0_4_) * fVar277;
      fVar260 = (-(float)local_508._4_4_ - auVar244._4_4_) * fVar290;
      fVar262 = (-fStack_500 - auVar244._8_4_) * fVar294;
      fVar264 = (-fStack_4fc - auVar244._12_4_) * fVar296;
      fVar277 = (auVar244._0_4_ - (float)local_508._0_4_) * fVar277;
      fVar290 = (auVar244._4_4_ - (float)local_508._4_4_) * fVar290;
      fVar294 = (auVar244._8_4_ - fStack_500) * fVar294;
      fVar296 = (auVar244._12_4_ - fStack_4fc) * fVar296;
      local_358._4_4_ = (fVar273 * fVar260 + fVar226) * fVar326;
      local_358._0_4_ = (fVar253 * fVar255 + fVar202) * fVar322;
      fStack_350 = (fVar328 * fVar262 + fVar228) * fVar323;
      fStack_34c = (fVar259 * fVar264 + fVar235) * fVar327;
      local_368[0] = (fVar253 * fVar277 + fVar202) * fVar322;
      local_368[1] = (fVar273 * fVar290 + fVar226) * fVar326;
      local_368[2] = (fVar328 * fVar294 + fVar228) * fVar323;
      local_368[3] = (fVar259 * fVar296 + fVar235) * fVar327;
      auVar257._0_4_ = (uint)fVar255 & uVar76;
      auVar257._4_4_ = (uint)fVar260 & uVar77;
      auVar257._8_4_ = (uint)fVar262 & uVar78;
      auVar257._12_4_ = (uint)fVar264 & uVar79;
      auVar192._0_8_ = CONCAT44(~uVar77,~uVar76) & 0x7f8000007f800000;
      auVar192._8_4_ = ~uVar78 & 0x7f800000;
      auVar192._12_4_ = ~uVar79 & 0x7f800000;
      auVar192 = auVar192 | auVar257;
      auVar341._0_4_ = (uint)fVar277 & uVar76;
      auVar341._4_4_ = (uint)fVar290 & uVar77;
      auVar341._8_4_ = (uint)fVar294 & uVar78;
      auVar341._12_4_ = (uint)fVar296 & uVar79;
      auVar283._0_8_ = CONCAT44(~uVar77,~uVar76) & 0xff800000ff800000;
      auVar283._8_4_ = ~uVar78 & 0xff800000;
      auVar283._12_4_ = ~uVar79 & 0xff800000;
      auVar283 = auVar283 | auVar341;
      auVar258._0_8_ = CONCAT44(fVar151,fVar150) & 0x7fffffff7fffffff;
      auVar258._8_4_ = ABS(fStack_490);
      auVar258._12_4_ = ABS(fStack_48c);
      auVar33._4_4_ = fStack_314;
      auVar33._0_4_ = local_318;
      auVar33._8_4_ = fStack_310;
      auVar33._12_4_ = fStack_30c;
      auVar154 = maxps(auVar33,auVar258);
      fVar150 = auVar154._0_4_ * 1.9073486e-06;
      fVar151 = auVar154._4_4_ * 1.9073486e-06;
      fVar322 = auVar154._8_4_ * 1.9073486e-06;
      fVar326 = auVar154._12_4_ * 1.9073486e-06;
      auVar342._0_4_ = -(uint)(ABS(auVar345._0_4_) < fVar150 && bVar20);
      auVar342._4_4_ = -(uint)(ABS(auVar345._4_4_) < fVar151 && bVar21);
      auVar342._8_4_ = -(uint)(ABS(auVar345._8_4_) < fVar322 && bVar22);
      auVar342._12_4_ = -(uint)(ABS(auVar345._12_4_) < fVar326 && bVar23);
      iVar58 = movmskps(iVar58,auVar342);
      auVar101._8_4_ = fVar323;
      auVar101._0_8_ = uVar311;
      auVar101._12_4_ = fVar327;
      if (iVar58 != 0) {
        uVar76 = -(uint)(fVar276 <= 0.0);
        uVar77 = -(uint)(fVar289 <= 0.0);
        uVar78 = -(uint)(fVar152 <= 0.0);
        uVar79 = -(uint)(fVar166 <= 0.0);
        auVar317._0_4_ = (uVar76 & 0xff800000 | ~uVar76 & 0x7f800000) & auVar342._0_4_;
        auVar317._4_4_ = (uVar77 & 0xff800000 | ~uVar77 & 0x7f800000) & auVar342._4_4_;
        auVar317._8_4_ = (uVar78 & 0xff800000 | ~uVar78 & 0x7f800000) & auVar342._8_4_;
        auVar317._12_4_ = (uVar79 & 0xff800000 | ~uVar79 & 0x7f800000) & auVar342._12_4_;
        auVar304._0_4_ = ~auVar342._0_4_ & auVar192._0_4_;
        auVar304._4_4_ = ~auVar342._4_4_ & auVar192._4_4_;
        auVar304._8_4_ = ~auVar342._8_4_ & auVar192._8_4_;
        auVar304._12_4_ = ~auVar342._12_4_ & auVar192._12_4_;
        auVar193._0_4_ = (uVar76 & 0x7f800000 | ~uVar76 & 0xff800000) & auVar342._0_4_;
        auVar193._4_4_ = (uVar77 & 0x7f800000 | ~uVar77 & 0xff800000) & auVar342._4_4_;
        auVar193._8_4_ = (uVar78 & 0x7f800000 | ~uVar78 & 0xff800000) & auVar342._8_4_;
        auVar193._12_4_ = (uVar79 & 0x7f800000 | ~uVar79 & 0xff800000) & auVar342._12_4_;
        auVar343._0_4_ = ~auVar342._0_4_ & auVar283._0_4_;
        auVar343._4_4_ = ~auVar342._4_4_ & auVar283._4_4_;
        auVar343._8_4_ = ~auVar342._8_4_ & auVar283._8_4_;
        auVar343._12_4_ = ~auVar342._12_4_ & auVar283._12_4_;
        auVar176._4_4_ = -(uint)((fVar151 <= ABS(auVar345._4_4_) || fVar289 <= 0.0) && bVar21);
        auVar176._0_4_ = -(uint)((fVar150 <= ABS(auVar345._0_4_) || fVar276 <= 0.0) && bVar20);
        auVar176._8_4_ = -(uint)((fVar322 <= ABS(auVar345._8_4_) || fVar152 <= 0.0) && bVar22);
        auVar176._12_4_ = -(uint)((fVar326 <= ABS(auVar345._12_4_) || fVar166 <= 0.0) && bVar23);
        auVar192 = auVar304 | auVar317;
        auVar283 = auVar343 | auVar193;
      }
    }
    auVar177._0_4_ = (auVar176._0_4_ << 0x1f) >> 0x1f;
    auVar177._4_4_ = (auVar176._4_4_ << 0x1f) >> 0x1f;
    auVar177._8_4_ = (auVar176._8_4_ << 0x1f) >> 0x1f;
    auVar177._12_4_ = (auVar176._12_4_ << 0x1f) >> 0x1f;
    auVar177 = auVar177 & local_168;
    iVar58 = movmskps(iVar58,auVar177);
    fVar150 = local_3f8;
    fVar151 = fStack_3f4;
    fVar152 = fStack_3f0;
    fVar166 = fStack_3ec;
    if (iVar58 == 0) {
LAB_00c255ce:
      lVar61 = CONCAT44(uVar65,iVar58);
    }
    else {
      local_388._4_4_ = fVar318;
      local_388._0_4_ = fVar309;
      fStack_380 = fVar320;
      fStack_37c = fVar324;
      local_4a8._4_4_ = (auVar270._4_4_ - auVar82._4_4_) * 0.99999976;
      local_4a8._0_4_ = (auVar270._0_4_ - auVar82._0_4_) * 0.99999976;
      fStack_4a0 = (auVar270._8_4_ - auVar82._8_4_) * 0.99999976;
      fStack_49c = (auVar270._12_4_ - auVar82._12_4_) * 0.99999976;
      local_178 = fVar253;
      fStack_174 = fVar273;
      fStack_170 = fVar328;
      fStack_16c = fVar259;
      _local_398 = auVar101;
      auVar82 = _local_398;
      local_408 = auVar345;
      auVar223._0_4_ = *(float *)(ray + k * 4 + 0x80) - (float)local_378._0_4_;
      auVar223._4_4_ = auVar223._0_4_;
      auVar223._8_4_ = auVar223._0_4_;
      auVar223._12_4_ = auVar223._0_4_;
      auVar270 = minps(auVar223,auVar283);
      auVar35._4_4_ = fStack_154;
      auVar35._0_4_ = local_158;
      auVar35._8_4_ = fStack_150;
      auVar35._12_4_ = fStack_14c;
      auVar244 = maxps(auVar35,auVar192);
      auVar102._0_4_ = fVar263 * fVar167 + fVar310 * fVar123;
      auVar102._4_4_ = fVar293 * fVar167 + fVar319 * fVar123;
      auVar102._8_4_ = fVar295 * fVar167 + fVar321 * fVar123;
      auVar102._12_4_ = fVar308 * fVar167 + fVar325 * fVar123;
      auVar332._0_4_ = fVar330 * local_478 + auVar102._0_4_;
      auVar332._4_4_ = local_428 * fStack_474 + auVar102._4_4_;
      auVar332._8_4_ = fStack_424 * fStack_470 + auVar102._8_4_;
      auVar332._12_4_ = fStack_420 * fStack_46c + auVar102._12_4_;
      auVar154 = rcpps(auVar102,auVar332);
      fVar276 = auVar154._0_4_;
      fVar289 = auVar154._4_4_;
      fVar322 = auVar154._8_4_;
      fVar326 = auVar154._12_4_;
      fVar277 = DAT_01feca10._4_4_;
      fVar255 = DAT_01feca10._12_4_;
      fVar323 = (float)DAT_01feca10;
      fVar327 = DAT_01feca10._8_4_;
      fVar329 = ((fVar323 - auVar332._0_4_ * fVar276) * fVar276 + fVar276) *
                -(fVar329 * fVar330 + fVar331 * fVar263 + local_438 * fVar310);
      fVar334 = ((fVar277 - auVar332._4_4_ * fVar289) * fVar289 + fVar289) *
                -(fVar334 * local_428 + fVar335 * fVar293 + fStack_434 * fVar319);
      fVar336 = ((fVar327 - auVar332._8_4_ * fVar322) * fVar322 + fVar322) *
                -(fVar336 * fStack_424 + fVar337 * fVar295 + fStack_430 * fVar321);
      fVar338 = ((fVar255 - auVar332._12_4_ * fVar326) * fVar326 + fVar326) *
                -(fVar338 * fStack_420 + fVar339 * fVar308 + fStack_42c * fVar325);
      uVar76 = -(uint)(auVar332._0_4_ < 0.0 || ABS(auVar332._0_4_) < 1e-18);
      uVar77 = -(uint)(auVar332._4_4_ < 0.0 || ABS(auVar332._4_4_) < 1e-18);
      uVar78 = -(uint)(auVar332._8_4_ < 0.0 || ABS(auVar332._8_4_) < 1e-18);
      uVar79 = -(uint)(auVar332._12_4_ < 0.0 || ABS(auVar332._12_4_) < 1e-18);
      uVar291 = DAT_01feba00._4_4_;
      uVar297 = DAT_01feba00._12_4_;
      uVar189 = (uint)DAT_01feba00;
      auVar194._0_4_ = uVar189 & uVar76;
      auVar194._4_4_ = uVar291 & uVar77;
      uVar203 = DAT_01feba00._8_4_;
      auVar194._8_4_ = uVar203 & uVar78;
      auVar194._12_4_ = uVar297 & uVar79;
      auVar103._0_4_ = ~uVar76 & (uint)fVar329;
      auVar103._4_4_ = ~uVar77 & (uint)fVar334;
      auVar103._8_4_ = ~uVar78 & (uint)fVar336;
      auVar103._12_4_ = ~uVar79 & (uint)fVar338;
      auVar244 = maxps(auVar244,auVar103 | auVar194);
      uVar76 = -(uint)(0.0 < auVar332._0_4_ || ABS(auVar332._0_4_) < 1e-18);
      uVar77 = -(uint)(0.0 < auVar332._4_4_ || ABS(auVar332._4_4_) < 1e-18);
      uVar78 = -(uint)(0.0 < auVar332._8_4_ || ABS(auVar332._8_4_) < 1e-18);
      uVar79 = -(uint)(0.0 < auVar332._12_4_ || ABS(auVar332._12_4_) < 1e-18);
      auVar104._0_4_ = (uint)DAT_01feb9f0 & uVar76;
      auVar104._4_4_ = DAT_01feb9f0._4_4_ & uVar77;
      auVar104._8_4_ = DAT_01feb9f0._8_4_ & uVar78;
      auVar104._12_4_ = DAT_01feb9f0._12_4_ & uVar79;
      auVar333._0_4_ = ~uVar76 & (uint)fVar329;
      auVar333._4_4_ = ~uVar77 & (uint)fVar334;
      auVar333._8_4_ = ~uVar78 & (uint)fVar336;
      auVar333._12_4_ = ~uVar79 & (uint)fVar338;
      auVar270 = minps(auVar270,auVar333 | auVar104);
      auVar137._0_4_ = (0.0 - fVar288) * -fVar293 + (0.0 - fVar292) * -fVar319;
      auVar137._4_4_ = (0.0 - fVar298) * -fVar295 + (0.0 - fVar305) * -fVar321;
      auVar137._8_4_ = (0.0 - fVar306) * -fVar308 + (0.0 - fVar307) * -fVar325;
      auVar137._12_4_ = 0x80000000;
      auVar346._0_4_ = -local_428 * local_478 + -fVar293 * fVar167 + -fVar319 * fVar123;
      auVar346._4_4_ = -fStack_424 * fStack_474 + -fVar295 * fVar167 + -fVar321 * fVar123;
      auVar346._8_4_ = -fStack_420 * fStack_470 + -fVar308 * fVar167 + -fVar325 * fVar123;
      auVar346._12_4_ = fStack_46c * -0.0 + fVar167 * -0.0 + fVar123 * -0.0;
      auVar154 = rcpps(auVar137,auVar346);
      fVar329 = auVar154._0_4_;
      fVar334 = auVar154._4_4_;
      fVar336 = auVar154._8_4_;
      fVar338 = auVar154._12_4_;
      fVar329 = ((fVar323 - auVar346._0_4_ * fVar329) * fVar329 + fVar329) *
                -((0.0 - fVar348) * -local_428 + auVar137._0_4_);
      fVar334 = ((fVar277 - auVar346._4_4_ * fVar334) * fVar334 + fVar334) *
                -((0.0 - fVar349) * -fStack_424 + auVar137._4_4_);
      fVar336 = ((fVar327 - auVar346._8_4_ * fVar336) * fVar336 + fVar336) *
                -((0.0 - fVar350) * -fStack_420 + auVar137._8_4_);
      fVar338 = ((fVar255 - auVar346._12_4_ * fVar338) * fVar338 + fVar338) * 0.0;
      uVar76 = -(uint)(auVar346._0_4_ < 0.0 || ABS(auVar346._0_4_) < 1e-18);
      uVar77 = -(uint)(auVar346._4_4_ < 0.0 || ABS(auVar346._4_4_) < 1e-18);
      uVar78 = -(uint)(auVar346._8_4_ < 0.0 || ABS(auVar346._8_4_) < 1e-18);
      uVar79 = -(uint)(auVar346._12_4_ < 0.0 || ABS(auVar346._12_4_) < 1e-18);
      auVar138._0_4_ = uVar189 & uVar76;
      auVar138._4_4_ = uVar291 & uVar77;
      auVar138._8_4_ = uVar203 & uVar78;
      auVar138._12_4_ = uVar297 & uVar79;
      auVar105._0_4_ = ~uVar76 & (uint)fVar329;
      auVar105._4_4_ = ~uVar77 & (uint)fVar334;
      auVar105._8_4_ = ~uVar78 & (uint)fVar336;
      auVar105._12_4_ = ~uVar79 & (uint)fVar338;
      auVar244 = maxps(auVar244,auVar105 | auVar138);
      uVar76 = -(uint)(0.0 < auVar346._0_4_ || ABS(auVar346._0_4_) < 1e-18);
      uVar77 = -(uint)(0.0 < auVar346._4_4_ || ABS(auVar346._4_4_) < 1e-18);
      uVar78 = -(uint)(0.0 < auVar346._8_4_ || ABS(auVar346._8_4_) < 1e-18);
      uVar79 = -(uint)(0.0 < auVar346._12_4_ || ABS(auVar346._12_4_) < 1e-18);
      auVar106._0_4_ = (uint)DAT_01feb9f0 & uVar76;
      auVar106._4_4_ = DAT_01feb9f0._4_4_ & uVar77;
      auVar106._8_4_ = DAT_01feb9f0._8_4_ & uVar78;
      auVar106._12_4_ = DAT_01feb9f0._12_4_ & uVar79;
      auVar347._0_4_ = ~uVar76 & (uint)fVar329;
      auVar347._4_4_ = ~uVar77 & (uint)fVar334;
      auVar347._8_4_ = ~uVar78 & (uint)fVar336;
      auVar347._12_4_ = ~uVar79 & (uint)fVar338;
      auVar154 = minps(auVar270,auVar347 | auVar106);
      fVar329 = auVar244._0_4_;
      fVar334 = auVar244._4_4_;
      fVar336 = auVar244._8_4_;
      fVar338 = auVar244._12_4_;
      auVar246._0_4_ = -(uint)(fVar329 <= auVar154._0_4_) & auVar177._0_4_;
      auVar246._4_4_ = -(uint)(fVar334 <= auVar154._4_4_) & auVar177._4_4_;
      auVar246._8_4_ = -(uint)(fVar336 <= auVar154._8_4_) & auVar177._8_4_;
      auVar246._12_4_ = -(uint)(fVar338 <= auVar154._12_4_) & auVar177._12_4_;
      iVar58 = movmskps(iVar58,auVar246);
      if (iVar58 == 0) goto LAB_00c255ce;
      auVar270 = maxps(ZEXT816(0),_local_4a8);
      auVar155 = minps(_local_358,_DAT_01feca10);
      auVar231._0_12_ = ZEXT812(0);
      auVar231._12_4_ = 0;
      auVar155 = maxps(auVar155,auVar231);
      auVar32._4_4_ = local_368[1];
      auVar32._0_4_ = local_368[0];
      auVar32._8_4_ = local_368[2];
      auVar32._12_4_ = local_368[3];
      auVar178 = minps(auVar32,_DAT_01feca10);
      auVar178 = maxps(auVar178,auVar231);
      local_358._0_4_ = (auVar155._0_4_ + 0.0) * 0.25 * (float)local_5c8._4_4_ + fVar122;
      local_358._4_4_ = (auVar155._4_4_ + 1.0) * 0.25 * (float)local_5c8._4_4_ + fVar122;
      fStack_350 = (auVar155._8_4_ + 2.0) * 0.25 * (float)local_5c8._4_4_ + fVar122;
      fStack_34c = (auVar155._12_4_ + 3.0) * 0.25 * (float)local_5c8._4_4_ + fVar122;
      local_368[0] = (auVar178._0_4_ + 0.0) * 0.25 * (float)local_5c8._4_4_ + fVar122;
      local_368[1] = (auVar178._4_4_ + 1.0) * 0.25 * (float)local_5c8._4_4_ + fVar122;
      local_368[2] = (auVar178._8_4_ + 2.0) * 0.25 * (float)local_5c8._4_4_ + fVar122;
      local_368[3] = (auVar178._12_4_ + 3.0) * 0.25 * (float)local_5c8._4_4_ + fVar122;
      fVar204 = fVar204 - auVar270._0_4_ * auVar270._0_4_;
      fVar227 = fVar227 - auVar270._4_4_ * auVar270._4_4_;
      fVar234 = fVar234 - auVar270._8_4_ * auVar270._8_4_;
      fVar236 = fVar236 - auVar270._12_4_ * auVar270._12_4_;
      auVar195._0_4_ = (float)local_508._0_4_ * (float)local_508._0_4_ - fVar309 * fVar204;
      auVar195._4_4_ = (float)local_508._4_4_ * (float)local_508._4_4_ - fVar318 * fVar227;
      auVar195._8_4_ = fStack_500 * fStack_500 - fVar320 * fVar234;
      auVar195._12_4_ = fStack_4fc * fStack_4fc - fVar324 * fVar236;
      local_4a8._4_4_ = -(uint)(0.0 <= auVar195._4_4_);
      local_4a8._0_4_ = -(uint)(0.0 <= auVar195._0_4_);
      fStack_4a0 = (float)-(uint)(0.0 <= auVar195._8_4_);
      fStack_49c = (float)-(uint)(0.0 <= auVar195._12_4_);
      iVar58 = movmskps(iVar58,_local_4a8);
      fStack_38c = auVar101._12_4_;
      if (iVar58 == 0) {
        _local_588 = ZEXT816(0);
        fVar253 = 0.0;
        fVar273 = 0.0;
        fVar328 = 0.0;
        fVar259 = 0.0;
        fVar202 = 0.0;
        fVar226 = 0.0;
        fVar228 = 0.0;
        fVar235 = 0.0;
        fVar309 = 0.0;
        fVar318 = 0.0;
        fVar320 = 0.0;
        fVar324 = 0.0;
        _local_648 = ZEXT816(0);
        _local_508 = ZEXT816(0);
        iVar58 = 0;
        auVar156 = _DAT_01feb9f0;
        auVar233 = _DAT_01feba00;
      }
      else {
        auVar155 = sqrtps(_local_5c8,auVar195);
        auVar139._0_4_ = auVar345._0_4_ + auVar345._0_4_;
        auVar139._4_4_ = auVar345._4_4_ + auVar345._4_4_;
        auVar139._8_4_ = auVar345._8_4_ + auVar345._8_4_;
        auVar139._12_4_ = auVar345._12_4_ + auVar345._12_4_;
        auVar270 = rcpps(_local_358,auVar139);
        fVar263 = auVar270._0_4_;
        fVar276 = auVar270._4_4_;
        fVar289 = auVar270._8_4_;
        fVar293 = auVar270._12_4_;
        fVar263 = (fVar323 - auVar139._0_4_ * fVar263) * fVar263 + fVar263;
        fVar276 = (fVar277 - auVar139._4_4_ * fVar276) * fVar276 + fVar276;
        fVar289 = (fVar327 - auVar139._8_4_ * fVar289) * fVar289 + fVar289;
        fVar293 = (fVar255 - auVar139._12_4_ * fVar293) * fVar293 + fVar293;
        fVar310 = (-(float)local_508._0_4_ - auVar155._0_4_) * fVar263;
        fVar322 = (-(float)local_508._4_4_ - auVar155._4_4_) * fVar276;
        fVar319 = (-fStack_500 - auVar155._8_4_) * fVar289;
        fVar326 = (-fStack_4fc - auVar155._12_4_) * fVar293;
        fVar263 = (auVar155._0_4_ - (float)local_508._0_4_) * fVar263;
        fVar276 = (auVar155._4_4_ - (float)local_508._4_4_) * fVar276;
        fVar289 = (auVar155._8_4_ - fStack_500) * fVar289;
        fVar293 = (auVar155._12_4_ - fStack_4fc) * fVar293;
        local_398._0_4_ = auVar101._0_4_;
        local_398._4_4_ = auVar101._4_4_;
        fStack_390 = auVar101._8_4_;
        fVar122 = (fVar253 * fVar310 + fVar202) * (float)local_398._0_4_;
        fVar124 = (fVar273 * fVar322 + fVar226) * (float)local_398._4_4_;
        fVar295 = (fVar328 * fVar319 + fVar228) * fStack_390;
        fVar308 = (fVar259 * fVar326 + fVar235) * fStack_38c;
        fVar309 = local_478 * fVar310 - (local_468 * fVar122 + fVar344);
        fVar318 = fStack_474 * fVar322 - (fStack_464 * fVar124 + fVar348);
        fVar320 = fStack_470 * fVar319 - (fStack_460 * fVar295 + fVar349);
        fVar324 = fStack_46c * fVar326 - (fStack_45c * fVar308 + fVar350);
        local_648._4_4_ = fVar167 * fVar322 - (fStack_454 * fVar124 + fVar288);
        local_648._0_4_ = fVar167 * fVar310 - (local_458 * fVar122 + fVar261);
        fStack_640 = fVar167 * fVar319 - (fStack_450 * fVar295 + fVar298);
        fStack_63c = fVar167 * fVar326 - (fStack_44c * fVar308 + fVar306);
        local_508._4_4_ = fVar123 * fVar322 - (fVar124 * fVar265 + fVar292);
        local_508._0_4_ = fVar123 * fVar310 - (fVar122 * fVar252 + fVar275);
        fStack_500 = fVar123 * fVar319 - (fVar295 * fVar274 + fVar305);
        fStack_4fc = fVar123 * fVar326 - (fVar308 * fVar254 + fVar307);
        fVar122 = (fVar253 * fVar263 + fVar202) * (float)local_398._0_4_;
        fVar124 = (fVar273 * fVar276 + fVar226) * (float)local_398._4_4_;
        fStack_390 = (fVar328 * fVar289 + fVar228) * fStack_390;
        fStack_38c = (fVar259 * fVar293 + fVar235) * fStack_38c;
        local_588._0_4_ = local_478 * fVar263 - (local_468 * fVar122 + fVar344);
        local_588._4_4_ = fStack_474 * fVar276 - (fStack_464 * fVar124 + fVar348);
        fStack_580 = fStack_470 * fVar289 - (fStack_460 * fStack_390 + fVar349);
        fStack_57c = fStack_46c * fVar293 - (fStack_45c * fStack_38c + fVar350);
        fVar253 = fVar167 * fVar263 - (local_458 * fVar122 + fVar261);
        fVar273 = fVar167 * fVar276 - (fStack_454 * fVar124 + fVar288);
        fVar328 = fVar167 * fVar289 - (fStack_450 * fStack_390 + fVar298);
        fVar259 = fVar167 * fVar293 - (fStack_44c * fStack_38c + fVar306);
        bVar20 = 0.0 <= auVar195._0_4_;
        uVar76 = -(uint)bVar20;
        bVar21 = 0.0 <= auVar195._4_4_;
        uVar77 = -(uint)bVar21;
        bVar22 = 0.0 <= auVar195._8_4_;
        uVar78 = -(uint)bVar22;
        bVar23 = 0.0 <= auVar195._12_4_;
        uVar79 = -(uint)bVar23;
        fVar202 = fVar123 * fVar263 - (fVar122 * fVar252 + fVar275);
        fVar226 = fVar123 * fVar276 - (fVar124 * fVar265 + fVar292);
        fVar228 = fVar123 * fVar289 - (fStack_390 * fVar274 + fVar305);
        fVar235 = fVar123 * fVar293 - (fStack_38c * fVar254 + fVar307);
        auVar232._0_4_ = (uint)fVar310 & uVar76;
        auVar232._4_4_ = (uint)fVar322 & uVar77;
        auVar232._8_4_ = (uint)fVar319 & uVar78;
        auVar232._12_4_ = (uint)fVar326 & uVar79;
        auVar156._0_8_ = CONCAT44(~uVar77,~uVar76) & 0x7f8000007f800000;
        auVar156._8_4_ = ~uVar78 & 0x7f800000;
        auVar156._12_4_ = ~uVar79 & 0x7f800000;
        auVar156 = auVar156 | auVar232;
        auVar247._0_4_ = (uint)fVar263 & uVar76;
        auVar247._4_4_ = (uint)fVar276 & uVar77;
        auVar247._8_4_ = (uint)fVar289 & uVar78;
        auVar247._12_4_ = (uint)fVar293 & uVar79;
        auVar233._0_8_ = CONCAT44(~uVar77,~uVar76) & 0xff800000ff800000;
        auVar233._8_4_ = ~uVar78 & 0xff800000;
        auVar233._12_4_ = ~uVar79 & 0xff800000;
        auVar233 = auVar233 | auVar247;
        auVar107._0_8_ = local_498 & 0x7fffffff7fffffff;
        auVar107._8_4_ = ABS(fStack_490);
        auVar107._12_4_ = ABS(fStack_48c);
        auVar34._4_4_ = fStack_314;
        auVar34._0_4_ = local_318;
        auVar34._8_4_ = fStack_310;
        auVar34._12_4_ = fStack_30c;
        auVar270 = maxps(auVar34,auVar107);
        fVar122 = auVar270._0_4_ * 1.9073486e-06;
        fVar124 = auVar270._4_4_ * 1.9073486e-06;
        fVar252 = auVar270._8_4_ * 1.9073486e-06;
        fVar265 = auVar270._12_4_ * 1.9073486e-06;
        auVar224._0_4_ = -(uint)(ABS(auVar345._0_4_) < fVar122 && bVar20);
        auVar224._4_4_ = -(uint)(ABS(auVar345._4_4_) < fVar124 && bVar21);
        auVar224._8_4_ = -(uint)(ABS(auVar345._8_4_) < fVar252 && bVar22);
        auVar224._12_4_ = -(uint)(ABS(auVar345._12_4_) < fVar265 && bVar23);
        iVar58 = movmskps(iVar58,auVar224);
        if (iVar58 != 0) {
          uVar76 = -(uint)(fVar204 <= 0.0);
          uVar77 = -(uint)(fVar227 <= 0.0);
          uVar78 = -(uint)(fVar234 <= 0.0);
          uVar79 = -(uint)(fVar236 <= 0.0);
          auVar286._0_4_ = (uVar76 & uVar189 | ~uVar76 & 0x7f800000) & auVar224._0_4_;
          auVar286._4_4_ = (uVar77 & uVar291 | ~uVar77 & 0x7f800000) & auVar224._4_4_;
          auVar286._8_4_ = (uVar78 & uVar203 | ~uVar78 & 0x7f800000) & auVar224._8_4_;
          auVar286._12_4_ = (uVar79 & uVar297 | ~uVar79 & 0x7f800000) & auVar224._12_4_;
          auVar272._0_4_ = ~auVar224._0_4_ & auVar156._0_4_;
          auVar272._4_4_ = ~auVar224._4_4_ & auVar156._4_4_;
          auVar272._8_4_ = ~auVar224._8_4_ & auVar156._8_4_;
          auVar272._12_4_ = ~auVar224._12_4_ & auVar156._12_4_;
          auVar156 = auVar272 | auVar286;
          auVar287._0_4_ = (uVar76 & 0x7f800000 | ~uVar76 & uVar189) & auVar224._0_4_;
          auVar287._4_4_ = (uVar77 & 0x7f800000 | ~uVar77 & uVar291) & auVar224._4_4_;
          auVar287._8_4_ = (uVar78 & 0x7f800000 | ~uVar78 & uVar203) & auVar224._8_4_;
          auVar287._12_4_ = (uVar79 & 0x7f800000 | ~uVar79 & uVar297) & auVar224._12_4_;
          auVar225._0_4_ = ~auVar224._0_4_ & auVar233._0_4_;
          auVar225._4_4_ = ~auVar224._4_4_ & auVar233._4_4_;
          auVar225._8_4_ = ~auVar224._8_4_ & auVar233._8_4_;
          auVar225._12_4_ = ~auVar224._12_4_ & auVar233._12_4_;
          auVar233 = auVar225 | auVar287;
          local_4a8._4_4_ = -(uint)((fVar124 <= ABS(auVar345._4_4_) || fVar227 <= 0.0) && bVar21);
          local_4a8._0_4_ = -(uint)((fVar122 <= ABS(auVar345._0_4_) || fVar204 <= 0.0) && bVar20);
          fStack_4a0 = (float)-(uint)((fVar252 <= ABS(auVar345._8_4_) || fVar234 <= 0.0) && bVar22);
          fStack_49c = (float)-(uint)((fVar265 <= ABS(auVar345._12_4_) || fVar236 <= 0.0) && bVar23)
          ;
        }
      }
      local_588._0_4_ = (float)local_588._0_4_ * local_478;
      local_588._4_4_ = (float)local_588._4_4_ * fStack_474;
      fStack_580 = fStack_580 * fStack_470;
      fStack_57c = fStack_57c * fStack_46c;
      _local_118 = auVar244;
      local_108 = minps(auVar154,auVar156);
      _local_1a8 = maxps(auVar244,auVar233);
      local_198 = auVar154;
      local_3a8._0_4_ = -(uint)(fVar329 <= local_108._0_4_) & auVar246._0_4_;
      local_3a8._4_4_ = -(uint)(fVar334 <= local_108._4_4_) & auVar246._4_4_;
      local_3a8._8_4_ = -(uint)(fVar336 <= local_108._8_4_) & auVar246._8_4_;
      local_3a8._12_4_ = -(uint)(fVar338 <= local_108._12_4_) & auVar246._12_4_;
      _local_498 = _local_1a8;
      local_3b8._0_8_ =
           CONCAT44(-(uint)(local_1a8._4_4_ <= auVar154._4_4_) & auVar246._4_4_,
                    -(uint)(local_1a8._0_4_ <= auVar154._0_4_) & auVar246._0_4_);
      local_3b8._8_4_ = -(uint)(local_1a8._8_4_ <= auVar154._8_4_) & auVar246._8_4_;
      local_3b8._12_4_ = -(uint)(local_1a8._12_4_ <= auVar154._12_4_) & auVar246._12_4_;
      auVar108._8_4_ = local_3b8._8_4_;
      auVar108._0_8_ = local_3b8._0_8_;
      auVar108._12_4_ = local_3b8._12_4_;
      iVar58 = movmskps(iVar58,auVar108 | local_3a8);
      lVar61 = CONCAT44(uVar65,iVar58);
      fVar122 = local_488;
      fVar124 = fStack_484;
      uVar59 = uStack_480;
      uVar168 = uStack_47c;
      _local_398 = auVar82;
      if (iVar58 != 0) {
        _local_388 = local_3b8;
        local_398._4_4_ = (int)local_510;
        local_398._0_4_ = (int)local_510;
        fStack_390 = (float)(int)local_510;
        fStack_38c = (float)(int)local_510;
        local_508._0_4_ =
             -(uint)((int)local_510 <
                    ((int)((-(uint)(0.3 <= ABS((float)local_508._0_4_ * fVar123 +
                                               (float)local_648._0_4_ * fVar167 +
                                               fVar309 * local_478)) & local_4a8._0_4_) << 0x1f) >>
                    0x1f) + 4);
        local_508._4_4_ =
             -(uint)((int)local_510 <
                    ((int)((-(uint)(0.3 <= ABS((float)local_508._4_4_ * fVar123 +
                                               (float)local_648._4_4_ * fVar167 +
                                               fVar318 * fStack_474)) & local_4a8._4_4_) << 0x1f) >>
                    0x1f) + 4);
        fStack_500 = (float)-(uint)((int)local_510 <
                                   ((int)((-(uint)(0.3 <= ABS(fStack_500 * fVar123 +
                                                              fStack_640 * fVar167 +
                                                              fVar320 * fStack_470)) &
                                          (uint)fStack_4a0) << 0x1f) >> 0x1f) + 4);
        fStack_4fc = (float)-(uint)((int)local_510 <
                                   ((int)((-(uint)(0.3 <= ABS(fStack_4fc * fVar123 +
                                                              fStack_63c * fVar167 +
                                                              fVar324 * fStack_46c)) &
                                          (uint)fStack_49c) << 0x1f) >> 0x1f) + 4);
        local_408 = local_3a8;
        local_3a8 = ~_local_508 & local_3a8;
        iVar58 = movmskps(iVar58,local_3a8);
        if (iVar58 != 0) {
          local_468 = local_3d8 + fVar329;
          fStack_464 = fStack_3d4 + fVar334;
          fStack_460 = fStack_3d0 + fVar336;
          fStack_45c = fStack_3cc + fVar338;
          do {
            auVar154 = ~local_3a8 & _DAT_01feb9f0 | local_3a8 & auVar244;
            auVar179._4_4_ = auVar154._0_4_;
            auVar179._0_4_ = auVar154._4_4_;
            auVar179._8_4_ = auVar154._12_4_;
            auVar179._12_4_ = auVar154._8_4_;
            auVar82 = minps(auVar179,auVar154);
            auVar140._0_8_ = auVar82._8_8_;
            auVar140._8_4_ = auVar82._0_4_;
            auVar140._12_4_ = auVar82._4_4_;
            auVar82 = minps(auVar140,auVar82);
            auVar141._0_8_ =
                 CONCAT44(-(uint)(auVar82._4_4_ == auVar154._4_4_) & local_3a8._4_4_,
                          -(uint)(auVar82._0_4_ == auVar154._0_4_) & local_3a8._0_4_);
            auVar141._8_4_ = -(uint)(auVar82._8_4_ == auVar154._8_4_) & local_3a8._8_4_;
            auVar141._12_4_ = -(uint)(auVar82._12_4_ == auVar154._12_4_) & local_3a8._12_4_;
            iVar58 = movmskps(iVar58,auVar141);
            auVar109 = local_3a8;
            if (iVar58 != 0) {
              auVar109._8_4_ = auVar141._8_4_;
              auVar109._0_8_ = auVar141._0_8_;
              auVar109._12_4_ = auVar141._12_4_;
            }
            uVar59 = movmskps(iVar58,auVar109);
            lVar61 = 0;
            if (CONCAT44(uVar65,uVar59) != 0) {
              for (; (CONCAT44(uVar65,uVar59) >> lVar61 & 1) == 0; lVar61 = lVar61 + 1) {
              }
            }
            *(undefined4 *)(local_3a8 + lVar61 * 4) = 0;
            fVar122 = *(float *)(local_358 + lVar61 * 4);
            auVar284 = ZEXT416(*(uint *)(local_118 + lVar61 * 4));
            fVar124 = SQRT(fVar201);
            if ((float)local_3e8._0_4_ < 0.0) {
              fVar124 = sqrtf((float)local_3e8._0_4_);
              lVar61 = extraout_RAX;
            }
            auVar26._4_4_ = fVar186;
            auVar26._0_4_ = fVar169;
            auVar26._8_4_ = fVar187;
            auVar26._12_4_ = fVar188;
            auVar30._4_4_ = fStack_4e4;
            auVar30._0_4_ = local_4e8;
            auVar30._8_4_ = fStack_4e0;
            auVar30._12_4_ = fStack_4dc;
            auVar154 = minps(auVar26,auVar30);
            auVar270 = maxps(auVar26,auVar30);
            auVar28._4_4_ = fStack_4f4;
            auVar28._0_4_ = local_4f8;
            auVar28._8_4_ = fStack_4f0;
            auVar28._12_4_ = fStack_4ec;
            auVar82 = minps(auVar28,_local_618);
            auVar154 = minps(auVar154,auVar82);
            auVar82 = maxps(auVar28,_local_618);
            auVar82 = maxps(auVar270,auVar82);
            auVar196._0_8_ = auVar154._0_8_ & 0x7fffffff7fffffff;
            auVar196._8_4_ = auVar154._8_4_ & 0x7fffffff;
            auVar196._12_4_ = auVar154._12_4_ & 0x7fffffff;
            local_458 = auVar82._12_4_;
            auVar110._0_8_ = auVar82._0_8_ & 0x7fffffff7fffffff;
            auVar110._8_4_ = auVar82._8_4_ & 0x7fffffff;
            auVar110._12_4_ = ABS(local_458);
            auVar82 = maxps(auVar196,auVar110);
            fVar150 = auVar82._4_4_;
            if (auVar82._4_4_ <= auVar82._0_4_) {
              fVar150 = auVar82._0_4_;
            }
            auVar197._8_8_ = auVar82._8_8_;
            auVar197._0_8_ = auVar82._8_8_;
            if (auVar82._8_4_ <= fVar150) {
              auVar197._0_4_ = fVar150;
            }
            fVar150 = auVar197._0_4_ * 1.9073486e-06;
            local_428 = fVar124 * 1.9073486e-06;
            fStack_454 = local_458;
            fStack_450 = local_458;
            fStack_44c = local_458;
            lVar68 = 5;
            do {
              fVar265 = auVar284._0_4_;
              fVar254 = 1.0 - fVar122;
              fVar274 = fVar122 * 3.0;
              fVar236 = -fVar122 * fVar254 * fVar254 * 0.5;
              fVar124 = (fVar122 * fVar122 * (fVar274 + -5.0) + 2.0) * 0.5;
              fVar166 = ((fVar254 * 3.0 + -5.0) * fVar254 * fVar254 + 2.0) * 0.5;
              fVar204 = -fVar254 * fVar122 * fVar122 * 0.5;
              fVar252 = fVar236 * fVar188 +
                        fVar124 * fStack_4dc + fVar166 * fStack_4ec + fVar204 * fStack_60c;
              fVar151 = fVar122 * -9.0 + 4.0;
              fVar152 = fVar274 + -1.0;
              fVar227 = (fVar265 * (float)local_3c8._0_4_ + 0.0) -
                        (fVar236 * fVar169 +
                        fVar124 * local_4e8 + fVar166 * local_4f8 + fVar204 * (float)local_618._0_4_
                        );
              fVar234 = (fVar265 * (float)local_3c8._4_4_ + 0.0) -
                        (fVar236 * fVar186 +
                        fVar124 * fStack_4e4 +
                        fVar166 * fStack_4f4 + fVar204 * (float)local_618._4_4_);
              fVar204 = (fVar265 * fStack_3c0 + 0.0) -
                        (fVar236 * fVar187 +
                        fVar124 * fStack_4e0 + fVar166 * fStack_4f0 + fVar204 * fStack_610);
              fVar166 = (fVar265 * fStack_3bc + 0.0) - fVar252;
              fVar124 = fVar234 * fVar234;
              fStack_590 = fVar204 * fVar204;
              fStack_58c = fVar166 * fVar166;
              local_598._0_4_ = fVar124 + fVar227 * fVar227 + fStack_590;
              local_598._4_4_ = fVar124 + fVar124 + fStack_58c;
              fStack_590 = fVar124 + fStack_590 + fStack_590;
              fStack_58c = fVar124 + fStack_58c + fStack_58c;
              local_438 = (float)local_598._0_4_;
              if ((float)local_598._0_4_ < 0.0) {
                fStack_444 = 0.0;
                fStack_440 = 0.0;
                fStack_43c = 0.0;
                local_448 = fVar254 * -2.0;
                fVar236 = sqrtf((float)local_598._0_4_);
                lVar61 = extraout_RAX_00;
                fVar124 = local_448;
              }
              else {
                fVar236 = SQRT((float)local_598._0_4_);
                fVar124 = fVar254 * -2.0;
              }
              fVar275 = (fVar122 * (fVar254 + fVar254) - fVar254 * fVar254) * 0.5;
              fVar261 = ((fVar122 + fVar122) * (fVar274 + -5.0) + fVar122 * fVar274) * 0.5;
              fVar274 = ((fVar274 + 2.0) * (fVar254 + fVar254) + fVar254 * -3.0 * fVar254) * 0.5;
              fVar124 = (fVar124 * fVar122 + fVar122 * fVar122) * 0.5;
              fVar288 = fVar275 * fVar169 +
                        fVar261 * local_4e8 + fVar274 * local_4f8 + fVar124 * (float)local_618._0_4_
              ;
              fVar292 = fVar275 * fVar186 +
                        fVar261 * fStack_4e4 +
                        fVar274 * fStack_4f4 + fVar124 * (float)local_618._4_4_;
              fVar298 = fVar275 * fVar187 +
                        fVar261 * fStack_4e0 + fVar274 * fStack_4f0 + fVar124 * fStack_610;
              fVar261 = fVar275 * fVar188 +
                        fVar261 * fStack_4dc + fVar274 * fStack_4ec + fVar124 * fStack_60c;
              fVar124 = fVar122 * -3.0 + 2.0;
              fVar275 = fVar122 * 9.0 + -5.0;
              fVar274 = fVar124 * fVar169 +
                        fVar275 * local_4e8 + fVar151 * local_4f8 + fVar152 * (float)local_618._0_4_
              ;
              fVar254 = fVar124 * fVar186 +
                        fVar275 * fStack_4e4 +
                        fVar151 * fStack_4f4 + fVar152 * (float)local_618._4_4_;
              fVar151 = fVar124 * fVar187 +
                        fVar275 * fStack_4e0 + fVar151 * fStack_4f0 + fVar152 * fStack_610;
              fVar124 = fVar150;
              if (fVar150 <= local_428 * fVar265) {
                fVar124 = local_428 * fVar265;
              }
              fVar152 = fVar292 * fVar292 + fVar288 * fVar288 + fVar298 * fVar298;
              auVar154 = ZEXT416((uint)fVar152);
              auVar82 = rsqrtss(ZEXT416((uint)fVar152),auVar154);
              fVar275 = auVar82._0_4_;
              fVar305 = fVar275 * fVar275 * fVar152 * -0.5 * fVar275 + fVar275 * 1.5;
              fVar275 = fVar151 * fVar298 + fVar254 * fVar292 + fVar274 * fVar288;
              auVar82 = rcpss(auVar154,auVar154);
              fVar320 = (2.0 - fVar152 * auVar82._0_4_) * auVar82._0_4_;
              fVar306 = fVar288 * fVar305;
              fVar307 = fVar292 * fVar305;
              fVar309 = fVar298 * fVar305;
              fVar318 = fVar261 * fVar305;
              local_628._0_4_ = -fVar288;
              local_628._4_4_ = -fVar292;
              if (fVar152 < 0.0) {
                local_628 = CONCAT44(fVar292,fVar288) ^ 0x8000000080000000;
                fVar324 = sqrtf(fVar152);
                lVar61 = extraout_RAX_01;
              }
              else {
                fVar324 = SQRT(fVar152);
              }
              fVar329 = fVar234 * fVar307;
              fVar334 = fVar204 * fVar309;
              fVar336 = fVar166 * fVar318;
              fVar338 = fVar329 + fVar227 * fVar306 + fVar334;
              fVar263 = fVar329 + fVar329 + fVar336;
              fVar334 = fVar329 + fVar334 + fVar334;
              fVar336 = fVar329 + fVar336 + fVar336;
              fVar324 = (fVar236 + 1.0) * (fVar150 / fVar324) + fVar236 * fVar150 + fVar124;
              fVar329 = fStack_3bc * fVar318;
              fVar275 = fVar309 * -fVar298 + fVar307 * local_628._4_4_ + fVar306 * (float)local_628
                        + fVar320 * (fVar152 * fVar151 - fVar275 * fVar298) * fVar305 * fVar204 +
                          fVar320 * (fVar152 * fVar254 - fVar275 * fVar292) * fVar305 * fVar234 +
                          fVar320 * (fVar152 * fVar274 - fVar275 * fVar288) * fVar305 * fVar227;
              fVar305 = fStack_3c0 * fVar309 +
                        (float)local_3c8._4_4_ * fVar307 + (float)local_3c8._0_4_ * fVar306;
              fVar151 = (float)local_598._0_4_ - fVar338 * fVar338;
              auVar111._0_8_ = CONCAT44((float)local_598._4_4_ - fVar263 * fVar263,fVar151);
              auVar111._8_4_ = fStack_590 - fVar334 * fVar334;
              auVar111._12_4_ = fStack_58c - fVar336 * fVar336;
              fVar254 = -fVar261 * fVar166;
              fVar236 = fStack_3c0 * fVar204;
              fVar166 = fStack_3bc * fVar166;
              fVar152 = (fVar236 +
                        (float)local_3c8._4_4_ * fVar234 + (float)local_3c8._0_4_ * fVar227) -
                        fVar338 * fVar305;
              auVar180._8_4_ = auVar111._8_4_;
              auVar180._0_8_ = auVar111._0_8_;
              auVar180._12_4_ = auVar111._12_4_;
              auVar82 = rsqrtss(auVar180,auVar111);
              fVar274 = auVar82._0_4_;
              fVar274 = fVar274 * fVar274 * fVar151 * -0.5 * fVar274 + fVar274 * 1.5;
              if (fVar151 < 0.0) {
                fVar151 = sqrtf(fVar151);
                lVar61 = extraout_RAX_02;
              }
              else {
                fVar151 = SQRT(fVar151);
              }
              fVar151 = fVar151 - fVar252;
              fVar252 = ((-fVar298 * fVar204 +
                         local_628._4_4_ * fVar234 + (float)local_628 * fVar227) - fVar338 * fVar275
                        ) * fVar274 - fVar261;
              auVar24._4_4_ = fVar166;
              auVar24._0_4_ = fVar152;
              auVar24._8_4_ = fVar236;
              auVar24._12_4_ = fVar166;
              auVar157._4_12_ = auVar24._4_12_;
              auVar157._0_4_ = fVar152 * fVar274;
              auVar249._0_8_ = CONCAT44(fVar254,fVar252) ^ 0x8000000080000000;
              auVar249._8_4_ = -fVar254;
              auVar249._12_4_ = fVar318 * -fVar261;
              auVar248._8_8_ = auVar249._8_8_;
              auVar248._0_8_ = CONCAT44(fVar275,fVar252) ^ 0x80000000;
              auVar181._0_4_ = fVar275 * auVar157._0_4_ - fVar305 * fVar252;
              auVar159._0_8_ = auVar157._0_8_;
              auVar159._8_4_ = fVar166;
              auVar159._12_4_ = -fVar329;
              auVar158._8_8_ = auVar159._8_8_;
              auVar158._0_8_ = CONCAT44(fVar305,auVar157._0_4_) ^ 0x8000000000000000;
              auVar181._4_4_ = auVar181._0_4_;
              auVar181._8_4_ = auVar181._0_4_;
              auVar181._12_4_ = auVar181._0_4_;
              auVar82 = divps(auVar158,auVar181);
              auVar154 = divps(auVar248,auVar181);
              fVar122 = fVar122 - (auVar82._4_4_ * fVar151 + auVar82._0_4_ * fVar338);
              auVar284._0_4_ = fVar265 - (auVar154._4_4_ * fVar151 + auVar154._0_4_ * fVar338);
              lVar61 = CONCAT71((int7)((ulong)lVar61 >> 8),1);
              if ((ABS(fVar338) < fVar324) &&
                 (ABS(fVar151) < local_458 * 1.9073486e-06 + fVar124 + fVar324)) {
                auVar284._0_4_ = auVar284._0_4_ + (float)local_378._0_4_;
                if ((auVar284._0_4_ < fVar81) ||
                   (((fVar124 = *(float *)(ray + k * 4 + 0x80), fVar124 < auVar284._0_4_ ||
                     (fVar122 < 0.0)) || (1.0 < fVar122)))) {
                  lVar61 = 0;
                  uVar70 = 0;
                }
                else {
                  auVar82 = rsqrtss(_local_598,_local_598);
                  fVar151 = auVar82._0_4_;
                  pGVar18 = (context->scene->geometries).items[local_410].ptr;
                  if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    lVar61 = 0;
                    uVar70 = 0;
                    pRVar66 = (RTCIntersectArguments *)context;
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar18->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      uVar70 = 1;
                      pRVar66 = (RTCIntersectArguments *)context;
                    }
                    else {
                      fVar151 = fVar151 * 1.5 + fVar151 * fVar151 * local_438 * -0.5 * fVar151;
                      fVar227 = fVar227 * fVar151;
                      fVar234 = fVar234 * fVar151;
                      fVar204 = fVar204 * fVar151;
                      fVar151 = fVar261 * fVar227 + fVar288;
                      fVar152 = fVar261 * fVar234 + fVar292;
                      fVar166 = fVar261 * fVar204 + fVar298;
                      fVar236 = fVar234 * fVar288 - fVar292 * fVar227;
                      fVar234 = fVar204 * fVar292 - fVar298 * fVar234;
                      fVar204 = fVar227 * fVar298 - fVar288 * fVar204;
                      local_218 = fVar234 * fVar152 - fVar204 * fVar151;
                      local_238._4_4_ = fVar204 * fVar166 - fVar236 * fVar152;
                      local_228 = fVar236 * fVar151 - fVar234 * fVar166;
                      local_238._0_4_ = local_238._4_4_;
                      fStack_230 = (float)local_238._4_4_;
                      fStack_22c = (float)local_238._4_4_;
                      fStack_224 = local_228;
                      fStack_220 = local_228;
                      fStack_21c = local_228;
                      fStack_214 = local_218;
                      fStack_210 = local_218;
                      fStack_20c = local_218;
                      local_208 = fVar122;
                      fStack_204 = fVar122;
                      fStack_200 = fVar122;
                      fStack_1fc = fVar122;
                      local_1f8 = 0;
                      uStack_1f0 = 0;
                      local_1e8 = CONCAT44(uStack_334,local_338);
                      uStack_1e0 = CONCAT44(uStack_32c,uStack_330);
                      local_1d8 = CONCAT44(uStack_324,local_328);
                      uStack_1d0 = CONCAT44(uStack_31c,uStack_320);
                      local_1c8 = context->user->instID[0];
                      uStack_1c4 = local_1c8;
                      uStack_1c0 = local_1c8;
                      uStack_1bc = local_1c8;
                      local_1b8 = context->user->instPrimID[0];
                      uStack_1b4 = local_1b8;
                      uStack_1b0 = local_1b8;
                      uStack_1ac = local_1b8;
                      *(float *)(ray + k * 4 + 0x80) = auVar284._0_4_;
                      local_528 = *local_418;
                      uStack_520 = local_418[1];
                      _local_4d8 = (int *)&local_528;
                      uStack_4d0 = pGVar18->userPtr;
                      local_4c8 = context->user;
                      local_4c0 = ray;
                      local_4b8 = (RTCHitN *)local_238;
                      local_4b0 = 4;
                      p_Var63 = pGVar18->occlusionFilterN;
                      pRVar66 = (RTCIntersectArguments *)context;
                      if (p_Var63 != (RTCFilterFunctionN)0x0) {
                        pRVar73 = (RTCFilterFunctionNArguments *)local_4d8;
                        p_Var63 = (RTCFilterFunctionN)(*p_Var63)(pRVar73);
                      }
                      auVar112._0_4_ = -(uint)((int)local_528 == 0);
                      auVar112._4_4_ = -(uint)(local_528._4_4_ == 0);
                      auVar112._8_4_ = -(uint)((int)uStack_520 == 0);
                      auVar112._12_4_ = -(uint)(uStack_520._4_4_ == 0);
                      uVar76 = movmskps((int)p_Var63,auVar112);
                      pRVar62 = (RayK<4> *)(ulong)(uVar76 ^ 0xf);
                      if ((uVar76 ^ 0xf) == 0) {
                        auVar112 = auVar112 ^ _DAT_01febe20;
                      }
                      else {
                        pRVar66 = context->args;
                        if (((RTCIntersectArguments *)pRVar66->filter !=
                             (RTCIntersectArguments *)0x0) &&
                           ((((ulong)*(Scene **)&pRVar66->flags & 2) != 0 ||
                            (((pGVar18->field_8).field_0x2 & 0x40) != 0)))) {
                          pRVar73 = (RTCFilterFunctionNArguments *)local_4d8;
                          (*(code *)pRVar66->filter)();
                        }
                        auVar142._0_4_ = -(uint)((int)local_528 == 0);
                        auVar142._4_4_ = -(uint)(local_528._4_4_ == 0);
                        auVar142._8_4_ = -(uint)((int)uStack_520 == 0);
                        auVar142._12_4_ = -(uint)(uStack_520._4_4_ == 0);
                        auVar112 = auVar142 ^ _DAT_01febe20;
                        *(undefined1 (*) [16])(local_4c0 + 0x80) =
                             ~auVar142 & _DAT_01feba00 |
                             *(undefined1 (*) [16])(local_4c0 + 0x80) & auVar142;
                        pRVar62 = local_4c0;
                      }
                      auVar113._0_4_ = auVar112._0_4_ << 0x1f;
                      auVar113._4_4_ = auVar112._4_4_ << 0x1f;
                      auVar113._8_4_ = auVar112._8_4_ << 0x1f;
                      auVar113._12_4_ = auVar112._12_4_ << 0x1f;
                      iVar58 = movmskps((int)pRVar62,auVar113);
                      uVar70 = (ulong)(iVar58 != 0);
                      if (iVar58 == 0) {
                        *(float *)(ray + k * 4 + 0x80) = fVar124;
                      }
                    }
                    lVar61 = 0;
                  }
                }
              }
              bVar69 = (byte)uVar70;
              if ((char)lVar61 == '\0') goto LAB_00c26322;
              lVar68 = lVar68 + -1;
            } while (lVar68 != 0);
            bVar69 = 0;
LAB_00c26322:
            uVar70 = (ulong)(bVar69 & 1);
            fVar122 = *(float *)(ray + k * 4 + 0x80);
            local_3a8._0_4_ = -(uint)(local_468 <= fVar122) & local_3a8._0_4_;
            local_3a8._4_4_ = -(uint)(fStack_464 <= fVar122) & local_3a8._4_4_;
            local_3a8._8_4_ = -(uint)(fStack_460 <= fVar122) & local_3a8._8_4_;
            local_3a8._12_4_ = -(uint)(fStack_45c <= fVar122) & local_3a8._12_4_;
            bVar74 = bVar74 | bVar69 & 1;
            uVar65 = (undefined4)((ulong)lVar61 >> 0x20);
            iVar58 = movmskps((int)lVar61,local_3a8);
          } while (iVar58 != 0);
        }
        auVar82 = _local_1a8;
        fVar122 = *(float *)(ray + k * 4 + 0x80);
        local_498._0_4_ = -(uint)((float)local_498._0_4_ + local_3d8 <= fVar122) & local_388._0_4_;
        local_498._4_4_ = -(uint)((float)local_498._4_4_ + fStack_3d4 <= fVar122) & local_388._4_4_;
        fStack_490 = (float)(-(uint)(fStack_490 + fStack_3d0 <= fVar122) & (uint)fStack_380);
        fStack_48c = (float)(-(uint)(fStack_48c + fStack_3cc <= fVar122) & (uint)fStack_37c);
        auVar160._0_4_ =
             -(uint)((int)local_398._0_4_ <
                    ((int)((-(uint)(0.3 <= ABS((float)local_588._0_4_ +
                                               fVar253 * fVar167 + fVar202 * fVar123)) &
                           local_4a8._0_4_) << 0x1f) >> 0x1f) + 4);
        auVar160._4_4_ =
             -(uint)((int)local_398._4_4_ <
                    ((int)((-(uint)(0.3 <= ABS((float)local_588._4_4_ +
                                               fVar273 * fVar167 + fVar226 * fVar123)) &
                           local_4a8._4_4_) << 0x1f) >> 0x1f) + 4);
        auVar160._8_4_ =
             -(uint)((int)fStack_390 <
                    ((int)((-(uint)(0.3 <= ABS(fStack_580 + fVar328 * fVar167 + fVar228 * fVar123))
                           & (uint)fStack_4a0) << 0x1f) >> 0x1f) + 4);
        auVar160._12_4_ =
             -(uint)((int)fStack_38c <
                    ((int)((-(uint)(0.3 <= ABS(fStack_57c + fVar259 * fVar167 + fVar235 * fVar123))
                           & (uint)fStack_49c) << 0x1f) >> 0x1f) + 4);
        local_3b8 = ~auVar160 & _local_498;
        iVar58 = movmskps(iVar58,local_3b8);
        if (iVar58 != 0) {
          local_468 = local_3d8 + (float)local_1a8._0_4_;
          fStack_464 = fStack_3d4 + (float)local_1a8._4_4_;
          fStack_460 = fStack_3d0 + fStack_1a0;
          fStack_45c = fStack_3cc + fStack_19c;
          do {
            auVar270 = ~local_3b8 & _DAT_01feb9f0 | local_3b8 & auVar82;
            auVar182._4_4_ = auVar270._0_4_;
            auVar182._0_4_ = auVar270._4_4_;
            auVar182._8_4_ = auVar270._12_4_;
            auVar182._12_4_ = auVar270._8_4_;
            auVar154 = minps(auVar182,auVar270);
            auVar143._0_8_ = auVar154._8_8_;
            auVar143._8_4_ = auVar154._0_4_;
            auVar143._12_4_ = auVar154._4_4_;
            auVar154 = minps(auVar143,auVar154);
            auVar144._0_8_ =
                 CONCAT44(-(uint)(auVar154._4_4_ == auVar270._4_4_) & local_3b8._4_4_,
                          -(uint)(auVar154._0_4_ == auVar270._0_4_) & local_3b8._0_4_);
            auVar144._8_4_ = -(uint)(auVar154._8_4_ == auVar270._8_4_) & local_3b8._8_4_;
            auVar144._12_4_ = -(uint)(auVar154._12_4_ == auVar270._12_4_) & local_3b8._12_4_;
            iVar58 = movmskps(iVar58,auVar144);
            auVar114 = local_3b8;
            if (iVar58 != 0) {
              auVar114._8_4_ = auVar144._8_4_;
              auVar114._0_8_ = auVar144._0_8_;
              auVar114._12_4_ = auVar144._12_4_;
            }
            uVar59 = movmskps(iVar58,auVar114);
            lVar61 = 0;
            if (CONCAT44(uVar65,uVar59) != 0) {
              for (; (CONCAT44(uVar65,uVar59) >> lVar61 & 1) == 0; lVar61 = lVar61 + 1) {
              }
            }
            *(undefined4 *)(local_3b8 + lVar61 * 4) = 0;
            fVar122 = local_368[lVar61];
            auVar285 = ZEXT416(*(uint *)(local_198 + lVar61 * 4));
            fVar124 = SQRT(fVar201);
            if ((float)local_3e8._0_4_ < 0.0) {
              fVar124 = sqrtf((float)local_3e8._0_4_);
              lVar61 = extraout_RAX_03;
            }
            auVar27._4_4_ = fVar186;
            auVar27._0_4_ = fVar169;
            auVar27._8_4_ = fVar187;
            auVar27._12_4_ = fVar188;
            auVar31._4_4_ = fStack_4e4;
            auVar31._0_4_ = local_4e8;
            auVar31._8_4_ = fStack_4e0;
            auVar31._12_4_ = fStack_4dc;
            auVar270 = minps(auVar27,auVar31);
            auVar244 = maxps(auVar27,auVar31);
            auVar29._4_4_ = fStack_4f4;
            auVar29._0_4_ = local_4f8;
            auVar29._8_4_ = fStack_4f0;
            auVar29._12_4_ = fStack_4ec;
            auVar154 = minps(auVar29,_local_618);
            auVar270 = minps(auVar270,auVar154);
            auVar154 = maxps(auVar29,_local_618);
            auVar154 = maxps(auVar244,auVar154);
            auVar198._0_8_ = auVar270._0_8_ & 0x7fffffff7fffffff;
            auVar198._8_4_ = auVar270._8_4_ & 0x7fffffff;
            auVar198._12_4_ = auVar270._12_4_ & 0x7fffffff;
            local_458 = auVar154._12_4_;
            auVar115._0_8_ = auVar154._0_8_ & 0x7fffffff7fffffff;
            auVar115._8_4_ = auVar154._8_4_ & 0x7fffffff;
            auVar115._12_4_ = ABS(local_458);
            auVar154 = maxps(auVar198,auVar115);
            fVar150 = auVar154._4_4_;
            if (auVar154._4_4_ <= auVar154._0_4_) {
              fVar150 = auVar154._0_4_;
            }
            auVar199._8_8_ = auVar154._8_8_;
            auVar199._0_8_ = auVar154._8_8_;
            if (auVar154._8_4_ <= fVar150) {
              auVar199._0_4_ = fVar150;
            }
            fVar150 = auVar199._0_4_ * 1.9073486e-06;
            local_428 = fVar124 * 1.9073486e-06;
            fStack_454 = local_458;
            fStack_450 = local_458;
            fStack_44c = local_458;
            lVar68 = 5;
            do {
              fVar234 = auVar285._0_4_;
              fVar236 = 1.0 - fVar122;
              fVar235 = fVar122 * 3.0;
              fVar227 = -fVar122 * fVar236 * fVar236 * 0.5;
              fVar124 = (fVar122 * fVar122 * (fVar235 + -5.0) + 2.0) * 0.5;
              fVar166 = ((fVar236 * 3.0 + -5.0) * fVar236 * fVar236 + 2.0) * 0.5;
              fVar202 = -fVar236 * fVar122 * fVar122 * 0.5;
              fVar228 = fVar227 * fVar188 +
                        fVar124 * fStack_4dc + fVar166 * fStack_4ec + fVar202 * fStack_60c;
              fVar151 = fVar122 * -9.0 + 4.0;
              fVar152 = fVar235 + -1.0;
              fVar204 = (fVar234 * (float)local_3c8._0_4_ + 0.0) -
                        (fVar227 * fVar169 +
                        fVar124 * local_4e8 + fVar166 * local_4f8 + fVar202 * (float)local_618._0_4_
                        );
              fVar226 = (fVar234 * (float)local_3c8._4_4_ + 0.0) -
                        (fVar227 * fVar186 +
                        fVar124 * fStack_4e4 +
                        fVar166 * fStack_4f4 + fVar202 * (float)local_618._4_4_);
              fVar202 = (fVar234 * fStack_3c0 + 0.0) -
                        (fVar227 * fVar187 +
                        fVar124 * fStack_4e0 + fVar166 * fStack_4f0 + fVar202 * fStack_610);
              fVar166 = (fVar234 * fStack_3bc + 0.0) - fVar228;
              fVar124 = fVar226 * fVar226;
              fStack_5f0 = fVar202 * fVar202;
              fStack_5ec = fVar166 * fVar166;
              local_5f8._0_4_ = fVar124 + fVar204 * fVar204 + fStack_5f0;
              local_5f8._4_4_ = fVar124 + fVar124 + fStack_5ec;
              fStack_5f0 = fVar124 + fStack_5f0 + fStack_5f0;
              fStack_5ec = fVar124 + fStack_5ec + fStack_5ec;
              local_438 = (float)local_5f8._0_4_;
              if ((float)local_5f8._0_4_ < 0.0) {
                fStack_444 = 0.0;
                fStack_440 = 0.0;
                fStack_43c = 0.0;
                local_448 = fVar236 * -2.0;
                fVar227 = sqrtf((float)local_5f8._0_4_);
                lVar61 = extraout_RAX_04;
                fVar124 = local_448;
              }
              else {
                fVar227 = SQRT((float)local_5f8._0_4_);
                fVar124 = fVar236 * -2.0;
              }
              fVar253 = (fVar122 * (fVar236 + fVar236) - fVar236 * fVar236) * 0.5;
              fVar252 = ((fVar122 + fVar122) * (fVar235 + -5.0) + fVar122 * fVar235) * 0.5;
              fVar235 = ((fVar235 + 2.0) * (fVar236 + fVar236) + fVar236 * -3.0 * fVar236) * 0.5;
              fVar124 = (fVar124 * fVar122 + fVar122 * fVar122) * 0.5;
              fVar265 = fVar253 * fVar169 +
                        fVar252 * local_4e8 + fVar235 * local_4f8 + fVar124 * (float)local_618._0_4_
              ;
              fVar273 = fVar253 * fVar186 +
                        fVar252 * fStack_4e4 +
                        fVar235 * fStack_4f4 + fVar124 * (float)local_618._4_4_;
              fVar274 = fVar253 * fVar187 +
                        fVar252 * fStack_4e0 + fVar235 * fStack_4f0 + fVar124 * fStack_610;
              fVar252 = fVar253 * fVar188 +
                        fVar252 * fStack_4dc + fVar235 * fStack_4ec + fVar124 * fStack_60c;
              fVar124 = fVar122 * -3.0 + 2.0;
              fVar253 = fVar122 * 9.0 + -5.0;
              fVar235 = fVar124 * fVar169 +
                        fVar253 * local_4e8 + fVar151 * local_4f8 + fVar152 * (float)local_618._0_4_
              ;
              fVar236 = fVar124 * fVar186 +
                        fVar253 * fStack_4e4 +
                        fVar151 * fStack_4f4 + fVar152 * (float)local_618._4_4_;
              fVar151 = fVar124 * fVar187 +
                        fVar253 * fStack_4e0 + fVar151 * fStack_4f0 + fVar152 * fStack_610;
              fVar124 = fVar150;
              if (fVar150 <= local_428 * fVar234) {
                fVar124 = local_428 * fVar234;
              }
              fVar152 = fVar273 * fVar273 + fVar265 * fVar265 + fVar274 * fVar274;
              auVar270 = ZEXT416((uint)fVar152);
              auVar154 = rsqrtss(ZEXT416((uint)fVar152),auVar270);
              fVar253 = auVar154._0_4_;
              fVar328 = fVar253 * fVar253 * fVar152 * -0.5 * fVar253 + fVar253 * 1.5;
              fVar253 = fVar151 * fVar274 + fVar236 * fVar273 + fVar235 * fVar265;
              auVar154 = rcpss(auVar270,auVar270);
              fVar288 = (2.0 - fVar152 * auVar154._0_4_) * auVar154._0_4_;
              fVar254 = fVar265 * fVar328;
              fVar259 = fVar273 * fVar328;
              fVar261 = fVar274 * fVar328;
              fVar275 = fVar252 * fVar328;
              local_628._0_4_ = -fVar265;
              local_628._4_4_ = -fVar273;
              if (fVar152 < 0.0) {
                local_628 = CONCAT44(fVar273,fVar265) ^ 0x8000000080000000;
                fVar292 = sqrtf(fVar152);
                lVar61 = extraout_RAX_05;
              }
              else {
                fVar292 = SQRT(fVar152);
              }
              fVar298 = fVar226 * fVar259;
              fVar305 = fVar202 * fVar261;
              fVar306 = fVar166 * fVar275;
              fVar307 = fVar298 + fVar204 * fVar254 + fVar305;
              fVar309 = fVar298 + fVar298 + fVar306;
              fVar305 = fVar298 + fVar305 + fVar305;
              fVar306 = fVar298 + fVar306 + fVar306;
              fVar292 = (fVar227 + 1.0) * (fVar150 / fVar292) + fVar227 * fVar150 + fVar124;
              fVar298 = fStack_3bc * fVar275;
              fVar253 = fVar261 * -fVar274 + fVar259 * local_628._4_4_ + fVar254 * (float)local_628
                        + fVar288 * (fVar152 * fVar151 - fVar253 * fVar274) * fVar328 * fVar202 +
                          fVar288 * (fVar152 * fVar236 - fVar253 * fVar273) * fVar328 * fVar226 +
                          fVar288 * (fVar152 * fVar235 - fVar253 * fVar265) * fVar328 * fVar204;
              fVar328 = fStack_3c0 * fVar261 +
                        (float)local_3c8._4_4_ * fVar259 + (float)local_3c8._0_4_ * fVar254;
              fVar151 = (float)local_5f8._0_4_ - fVar307 * fVar307;
              auVar116._0_8_ = CONCAT44((float)local_5f8._4_4_ - fVar309 * fVar309,fVar151);
              auVar116._8_4_ = fStack_5f0 - fVar305 * fVar305;
              auVar116._12_4_ = fStack_5ec - fVar306 * fVar306;
              fVar236 = -fVar252 * fVar166;
              fVar227 = fStack_3c0 * fVar202;
              fVar166 = fStack_3bc * fVar166;
              fVar152 = (fVar227 +
                        (float)local_3c8._4_4_ * fVar226 + (float)local_3c8._0_4_ * fVar204) -
                        fVar307 * fVar328;
              auVar183._8_4_ = auVar116._8_4_;
              auVar183._0_8_ = auVar116._0_8_;
              auVar183._12_4_ = auVar116._12_4_;
              auVar154 = rsqrtss(auVar183,auVar116);
              fVar235 = auVar154._0_4_;
              fVar235 = fVar235 * fVar235 * fVar151 * -0.5 * fVar235 + fVar235 * 1.5;
              if (fVar151 < 0.0) {
                fVar151 = sqrtf(fVar151);
                lVar61 = extraout_RAX_06;
              }
              else {
                fVar151 = SQRT(fVar151);
              }
              fVar151 = fVar151 - fVar228;
              fVar228 = ((-fVar274 * fVar202 +
                         local_628._4_4_ * fVar226 + (float)local_628 * fVar204) - fVar307 * fVar253
                        ) * fVar235 - fVar252;
              auVar25._4_4_ = fVar166;
              auVar25._0_4_ = fVar152;
              auVar25._8_4_ = fVar227;
              auVar25._12_4_ = fVar166;
              auVar161._4_12_ = auVar25._4_12_;
              auVar161._0_4_ = fVar152 * fVar235;
              auVar251._0_8_ = CONCAT44(fVar236,fVar228) ^ 0x8000000080000000;
              auVar251._8_4_ = -fVar236;
              auVar251._12_4_ = fVar275 * -fVar252;
              auVar250._8_8_ = auVar251._8_8_;
              auVar250._0_8_ = CONCAT44(fVar253,fVar228) ^ 0x80000000;
              auVar184._0_4_ = fVar253 * auVar161._0_4_ - fVar328 * fVar228;
              auVar163._0_8_ = auVar161._0_8_;
              auVar163._8_4_ = fVar166;
              auVar163._12_4_ = -fVar298;
              auVar162._8_8_ = auVar163._8_8_;
              auVar162._0_8_ = CONCAT44(fVar328,auVar161._0_4_) ^ 0x8000000000000000;
              auVar184._4_4_ = auVar184._0_4_;
              auVar184._8_4_ = auVar184._0_4_;
              auVar184._12_4_ = auVar184._0_4_;
              auVar154 = divps(auVar162,auVar184);
              auVar270 = divps(auVar250,auVar184);
              fVar122 = fVar122 - (auVar154._4_4_ * fVar151 + auVar154._0_4_ * fVar307);
              auVar285._0_4_ = fVar234 - (auVar270._4_4_ * fVar151 + auVar270._0_4_ * fVar307);
              lVar61 = CONCAT71((int7)((ulong)lVar61 >> 8),1);
              if ((ABS(fVar307) < fVar292) &&
                 (ABS(fVar151) < local_458 * 1.9073486e-06 + fVar124 + fVar292)) {
                auVar285._0_4_ = auVar285._0_4_ + (float)local_378._0_4_;
                if ((fVar81 <= auVar285._0_4_) &&
                   (((fVar124 = *(float *)(ray + k * 4 + 0x80), auVar285._0_4_ <= fVar124 &&
                     (0.0 <= fVar122)) && (fVar122 <= 1.0)))) {
                  auVar154 = rsqrtss(_local_5f8,_local_5f8);
                  fVar151 = auVar154._0_4_;
                  pGVar18 = (context->scene->geometries).items[local_410].ptr;
                  pRVar66 = (RTCIntersectArguments *)context;
                  if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar18->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      uVar70 = 1;
                    }
                    else {
                      fVar151 = fVar151 * 1.5 + fVar151 * fVar151 * local_438 * -0.5 * fVar151;
                      fVar204 = fVar204 * fVar151;
                      fVar226 = fVar226 * fVar151;
                      fVar202 = fVar202 * fVar151;
                      fVar151 = fVar252 * fVar204 + fVar265;
                      fVar152 = fVar252 * fVar226 + fVar273;
                      fVar166 = fVar252 * fVar202 + fVar274;
                      fVar227 = fVar226 * fVar265 - fVar273 * fVar204;
                      fVar226 = fVar202 * fVar273 - fVar274 * fVar226;
                      fVar202 = fVar204 * fVar274 - fVar265 * fVar202;
                      local_218 = fVar226 * fVar152 - fVar202 * fVar151;
                      local_238._4_4_ = fVar202 * fVar166 - fVar227 * fVar152;
                      local_228 = fVar227 * fVar151 - fVar226 * fVar166;
                      local_238._0_4_ = local_238._4_4_;
                      fStack_230 = (float)local_238._4_4_;
                      fStack_22c = (float)local_238._4_4_;
                      fStack_224 = local_228;
                      fStack_220 = local_228;
                      fStack_21c = local_228;
                      fStack_214 = local_218;
                      fStack_210 = local_218;
                      fStack_20c = local_218;
                      local_208 = fVar122;
                      fStack_204 = fVar122;
                      fStack_200 = fVar122;
                      fStack_1fc = fVar122;
                      local_1f8 = 0;
                      uStack_1f0 = 0;
                      local_1e8 = CONCAT44(uStack_334,local_338);
                      uStack_1e0 = CONCAT44(uStack_32c,uStack_330);
                      local_1d8 = CONCAT44(uStack_324,local_328);
                      uStack_1d0 = CONCAT44(uStack_31c,uStack_320);
                      local_1c8 = context->user->instID[0];
                      uStack_1c4 = local_1c8;
                      uStack_1c0 = local_1c8;
                      uStack_1bc = local_1c8;
                      local_1b8 = context->user->instPrimID[0];
                      uStack_1b4 = local_1b8;
                      uStack_1b0 = local_1b8;
                      uStack_1ac = local_1b8;
                      *(float *)(ray + k * 4 + 0x80) = auVar285._0_4_;
                      local_528 = *local_418;
                      uStack_520 = local_418[1];
                      _local_4d8 = (int *)&local_528;
                      uStack_4d0 = pGVar18->userPtr;
                      local_4c8 = context->user;
                      local_4c0 = ray;
                      local_4b8 = (RTCHitN *)local_238;
                      local_4b0 = 4;
                      p_Var63 = pGVar18->occlusionFilterN;
                      if (p_Var63 != (RTCFilterFunctionN)0x0) {
                        pRVar73 = (RTCFilterFunctionNArguments *)local_4d8;
                        p_Var63 = (RTCFilterFunctionN)(*p_Var63)(pRVar73);
                      }
                      auVar117._0_4_ = -(uint)((int)local_528 == 0);
                      auVar117._4_4_ = -(uint)(local_528._4_4_ == 0);
                      auVar117._8_4_ = -(uint)((int)uStack_520 == 0);
                      auVar117._12_4_ = -(uint)(uStack_520._4_4_ == 0);
                      uVar76 = movmskps((int)p_Var63,auVar117);
                      pRVar62 = (RayK<4> *)(ulong)(uVar76 ^ 0xf);
                      if ((uVar76 ^ 0xf) == 0) {
                        auVar117 = auVar117 ^ _DAT_01febe20;
                      }
                      else {
                        pRVar66 = context->args;
                        if (((RTCIntersectArguments *)pRVar66->filter !=
                             (RTCIntersectArguments *)0x0) &&
                           ((((ulong)*(Scene **)&pRVar66->flags & 2) != 0 ||
                            (((pGVar18->field_8).field_0x2 & 0x40) != 0)))) {
                          pRVar73 = (RTCFilterFunctionNArguments *)local_4d8;
                          (*(code *)pRVar66->filter)();
                        }
                        auVar145._0_4_ = -(uint)((int)local_528 == 0);
                        auVar145._4_4_ = -(uint)(local_528._4_4_ == 0);
                        auVar145._8_4_ = -(uint)((int)uStack_520 == 0);
                        auVar145._12_4_ = -(uint)(uStack_520._4_4_ == 0);
                        auVar117 = auVar145 ^ _DAT_01febe20;
                        *(undefined1 (*) [16])(local_4c0 + 0x80) =
                             ~auVar145 & _DAT_01feba00 |
                             *(undefined1 (*) [16])(local_4c0 + 0x80) & auVar145;
                        pRVar62 = local_4c0;
                      }
                      auVar118._0_4_ = auVar117._0_4_ << 0x1f;
                      auVar118._4_4_ = auVar117._4_4_ << 0x1f;
                      auVar118._8_4_ = auVar117._8_4_ << 0x1f;
                      auVar118._12_4_ = auVar117._12_4_ << 0x1f;
                      iVar58 = movmskps((int)pRVar62,auVar118);
                      uVar70 = (ulong)(iVar58 != 0);
                      if (iVar58 == 0) {
                        *(float *)(ray + k * 4 + 0x80) = fVar124;
                      }
                    }
                    lVar61 = 0;
                    goto LAB_00c26c65;
                  }
                }
                lVar61 = 0;
                uVar70 = 0;
              }
LAB_00c26c65:
              bVar69 = (byte)uVar70;
              if ((char)lVar61 == '\0') goto LAB_00c26f81;
              lVar68 = lVar68 + -1;
            } while (lVar68 != 0);
            bVar69 = 0;
LAB_00c26f81:
            uVar70 = (ulong)(bVar69 & 1);
            fVar122 = *(float *)(ray + k * 4 + 0x80);
            local_3b8._0_4_ = -(uint)(local_468 <= fVar122) & local_3b8._0_4_;
            local_3b8._4_4_ = -(uint)(fStack_464 <= fVar122) & local_3b8._4_4_;
            local_3b8._8_4_ = -(uint)(fStack_460 <= fVar122) & local_3b8._8_4_;
            local_3b8._12_4_ = -(uint)(fStack_45c <= fVar122) & local_3b8._12_4_;
            bVar74 = bVar74 | bVar69 & 1;
            uVar65 = (undefined4)((ulong)lVar61 >> 0x20);
            iVar58 = movmskps((int)lVar61,local_3b8);
          } while (iVar58 != 0);
        }
        fVar122 = *(float *)(ray + k * 4 + 0x80);
        auVar200._0_4_ =
             local_508._0_4_ & local_408._0_4_ &
             -(uint)(local_3d8 + (float)local_118._0_4_ <= fVar122);
        auVar200._4_4_ =
             local_508._4_4_ & local_408._4_4_ &
             -(uint)(fStack_3d4 + (float)local_118._4_4_ <= fVar122);
        auVar200._8_4_ =
             (uint)fStack_500 & local_408._8_4_ & -(uint)(fStack_3d0 + fStack_110 <= fVar122);
        auVar200._12_4_ =
             (uint)fStack_4fc & local_408._12_4_ & -(uint)(fStack_3cc + fStack_10c <= fVar122);
        auVar164._0_4_ =
             auVar160._0_4_ & local_498._0_4_ &
             -(uint)(local_3d8 + (float)local_1a8._0_4_ <= fVar122);
        auVar164._4_4_ =
             auVar160._4_4_ & local_498._4_4_ &
             -(uint)(fStack_3d4 + (float)local_1a8._4_4_ <= fVar122);
        auVar164._8_4_ =
             auVar160._8_4_ & (uint)fStack_490 & -(uint)(fStack_3d0 + fStack_1a0 <= fVar122);
        auVar164._12_4_ =
             auVar160._12_4_ & (uint)fStack_48c & -(uint)(fStack_3cc + fStack_19c <= fVar122);
        iVar58 = movmskps(iVar58,auVar164 | auVar200);
        lVar61 = CONCAT44(uVar65,iVar58);
        fVar150 = local_3f8;
        fVar151 = fStack_3f4;
        fVar152 = fStack_3f0;
        fVar166 = fStack_3ec;
        fVar122 = local_488;
        fVar124 = fStack_484;
        uVar59 = uStack_480;
        uVar168 = uStack_47c;
        if (iVar58 != 0) {
          uVar64 = (ulong)uVar75;
          lVar61 = uVar64 * 0x30;
          *(undefined1 (*) [16])(local_f8 + uVar64 * 0xc) = auVar164 | auVar200;
          afStack_e8[uVar64 * 0xc] =
               (float)(~auVar200._0_4_ & local_1a8._0_4_ | local_118._0_4_ & auVar200._0_4_);
          afStack_e8[uVar64 * 0xc + 1] =
               (float)(~auVar200._4_4_ & local_1a8._4_4_ | local_118._4_4_ & auVar200._4_4_);
          afStack_e8[uVar64 * 0xc + 2] =
               (float)(~auVar200._8_4_ & (uint)fStack_1a0 | (uint)fStack_110 & auVar200._8_4_);
          afStack_e8[uVar64 * 0xc + 3] =
               (float)(~auVar200._12_4_ & (uint)fStack_19c | (uint)fStack_10c & auVar200._12_4_);
          local_d0[uVar64 * 0xc + -2] = local_488;
          local_d0[uVar64 * 0xc + -1] = fStack_484;
          fVar202 = (float)((int)local_510 + 1);
          pRVar66 = (RTCIntersectArguments *)(ulong)(uint)fVar202;
          local_d0[uVar64 * 0xc] = fVar202;
          uVar75 = uVar75 + 1;
        }
      }
    }
    do {
      if (uVar75 == 0) {
        if (bVar74 != 0) {
          return local_699;
        }
        fVar167 = *(float *)(ray + k * 4 + 0x80);
        auVar149._4_4_ = -(uint)(fStack_184 <= fVar167);
        auVar149._0_4_ = -(uint)(local_188 <= fVar167);
        auVar149._8_4_ = -(uint)(fStack_180 <= fVar167);
        auVar149._12_4_ = -(uint)(fStack_17c <= fVar167);
        uVar75 = movmskps((int)pRVar66,auVar149);
        uVar75 = (uint)local_340 - 1 & (uint)local_340 & uVar75;
        local_699 = uVar75 != 0;
        if (!local_699) {
          return local_699;
        }
        goto LAB_00c2445f;
      }
      uVar76 = uVar75 - 1;
      pRVar66 = (RTCIntersectArguments *)(ulong)uVar76;
      fVar202 = *(float *)(ray + k * 4 + 0x80);
      auVar119._0_4_ =
           -(uint)(local_3d8 + afStack_e8[(long)pRVar66 * 0xc] <= fVar202) &
           local_f8[(long)pRVar66 * 0xc];
      auVar119._4_4_ =
           -(uint)(fStack_3d4 + afStack_e8[(long)pRVar66 * 0xc + 1] <= fVar202) &
           local_f8[(long)pRVar66 * 0xc + 1];
      auVar119._8_4_ =
           -(uint)(fStack_3d0 + afStack_e8[(long)pRVar66 * 0xc + 2] <= fVar202) &
           local_f8[(long)pRVar66 * 0xc + 2];
      auVar119._12_4_ =
           -(uint)(fStack_3cc + afStack_e8[(long)pRVar66 * 0xc + 3] <= fVar202) &
           (uint)afStack_e8[(long)pRVar66 * 0xc + -1];
      _local_238 = auVar119;
      iVar58 = movmskps((int)lVar61,auVar119);
      lVar61 = CONCAT44((int)((ulong)lVar61 >> 0x20),iVar58);
      if (iVar58 != 0) {
        auVar146._0_4_ = (uint)afStack_e8[(long)pRVar66 * 0xc] & auVar119._0_4_;
        auVar146._4_4_ = (uint)afStack_e8[(long)pRVar66 * 0xc + 1] & auVar119._4_4_;
        auVar146._8_4_ = (uint)afStack_e8[(long)pRVar66 * 0xc + 2] & auVar119._8_4_;
        auVar146._12_4_ = (uint)afStack_e8[(long)pRVar66 * 0xc + 3] & auVar119._12_4_;
        auVar165._0_8_ = CONCAT44(~auVar119._4_4_,~auVar119._0_4_) & 0x7f8000007f800000;
        auVar165._8_4_ = ~auVar119._8_4_ & 0x7f800000;
        auVar165._12_4_ = ~auVar119._12_4_ & 0x7f800000;
        auVar165 = auVar165 | auVar146;
        auVar185._4_4_ = auVar165._0_4_;
        auVar185._0_4_ = auVar165._4_4_;
        auVar185._8_4_ = auVar165._12_4_;
        auVar185._12_4_ = auVar165._8_4_;
        auVar82 = minps(auVar185,auVar165);
        auVar147._0_8_ = auVar82._8_8_;
        auVar147._8_4_ = auVar82._0_4_;
        auVar147._12_4_ = auVar82._4_4_;
        auVar82 = minps(auVar147,auVar82);
        auVar148._0_8_ =
             CONCAT44(-(uint)(auVar82._4_4_ == auVar165._4_4_) & auVar119._4_4_,
                      -(uint)(auVar82._0_4_ == auVar165._0_4_) & auVar119._0_4_);
        auVar148._8_4_ = -(uint)(auVar82._8_4_ == auVar165._8_4_) & auVar119._8_4_;
        auVar148._12_4_ = -(uint)(auVar82._12_4_ == auVar165._12_4_) & auVar119._12_4_;
        iVar71 = movmskps((int)lVar72,auVar148);
        if (iVar71 != 0) {
          auVar119._8_4_ = auVar148._8_4_;
          auVar119._0_8_ = auVar148._0_8_;
          auVar119._12_4_ = auVar148._12_4_;
        }
        fVar122 = local_d0[(long)pRVar66 * 0xc + -2];
        fVar124 = local_d0[(long)pRVar66 * 0xc + -1];
        uVar59 = movmskps(iVar71,auVar119);
        uVar64 = CONCAT44((int)((ulong)lVar72 >> 0x20),uVar59);
        lVar72 = 0;
        if (uVar64 != 0) {
          for (; (uVar64 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
          }
        }
        *(undefined4 *)(local_238 + lVar72 * 4) = 0;
        iVar71 = movmskps((int)pRVar73,_local_238);
        pRVar73 = (RTCFilterFunctionNArguments *)(ulong)(uint)local_d0[(long)pRVar66 * 0xc];
        if (iVar71 == 0) {
          uVar75 = uVar76;
        }
        *(undefined1 (*) [16])(local_f8 + (long)pRVar66 * 0xc) = _local_238;
        fVar124 = fVar124 - fVar122;
        _local_4d8 = (int *)CONCAT44(fVar124 * 0.33333334 + fVar122,fVar124 * 0.0 + fVar122);
        uStack_4d0 = (void *)CONCAT44(fVar124 * 1.0 + fVar122,fVar124 * 0.6666667 + fVar122);
        fVar122 = *(float *)(local_4d8 + lVar72 * 4);
        fVar124 = *(float *)(local_4d8 + lVar72 * 4 + 4);
        uVar59 = 0;
        uVar168 = 0;
        uVar76 = uVar75;
        local_510 = pRVar73;
      }
      uVar75 = uVar76;
    } while ((char)iVar58 == '\0');
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }